

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomMesh *mesh,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __v;
  optional<unsigned_int> oVar1;
  optional<unsigned_int> oVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Rb_tree_header *p_Var5;
  mapped_type mVar6;
  uint uVar7;
  code *pcVar8;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *pTVar9;
  undefined8 uVar10;
  bool bVar11;
  __type _Var12;
  int iVar13;
  int iVar14;
  ostream *poVar15;
  optional<unsigned_int> *poVar16;
  const_iterator cVar17;
  mapped_type *this;
  _Base_ptr p_Var18;
  mapped_type *pmVar19;
  undefined **in;
  char *pcVar20;
  char *pcVar21;
  Property *pPVar22;
  bool bVar23;
  Attribute *attr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ParseResult ret;
  ostringstream ss_e;
  undefined8 in_stack_fffffffffffff8f8;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *target;
  string local_700;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  Property *local_6b8;
  string *local_6b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690;
  optional<tinyusdz::Relationship> *local_660;
  undefined1 local_658 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_640 [5];
  ios_base local_5e8 [264];
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>_>
  *local_4e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomMesh::InterpolateBoundary>_>
  *local_4d8;
  TypedAttributeWithFallback<tinyusdz::GeomMesh::SubdivisionScheme> *local_4d0;
  undefined1 local_4c8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_490;
  storage_union sStack_480;
  undefined1 local_470 [48];
  bool local_440;
  storage_t<double> local_438;
  bool local_430;
  storage_t<tinyusdz::Token> local_428;
  undefined1 local_408 [48];
  undefined1 local_3d8 [40];
  undefined1 local_3b0 [56];
  undefined1 local_378 [40];
  undefined1 local_350 [40];
  undefined1 local_328 [40];
  _Rb_tree_node_base local_300;
  size_t local_2e0;
  undefined1 auStack_2d8 [32];
  bool bStack_2b8;
  undefined7 local_2b7;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2b0;
  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
  *local_290;
  storage_t<tinyusdz::Token> local_288;
  string *local_268;
  string *local_260;
  _Base_ptr local_258;
  _Base_ptr local_250;
  optional<tinyusdz::Relationship> *local_248;
  string *local_240;
  pointer local_238;
  pointer local_230;
  pointer local_228;
  _Base_ptr local_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  string local_1f8 [16];
  size_type local_1e8 [2];
  string local_1d8 [16];
  size_type local_1c8 [2];
  string local_1b8 [16];
  size_type local_1a8 [2];
  string local_198 [16];
  size_type local_188 [2];
  string local_178 [16];
  size_type local_168 [2];
  string local_158 [16];
  long local_148 [2];
  pointer local_138 [2];
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  undefined1 auStack_80 [8];
  EnumHandlerFun<tinyusdz::GeomMesh::InterpolateBoundary> local_78;
  storage_t<tinyusdz::Token> local_58;
  
  local_690._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_690._M_impl.super__Rb_tree_header._M_header;
  local_690._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar23 = false;
  local_690._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_690._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            *)CONCAT44((int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                       (uint)options->strict_allowedToken_check);
  local_6e0 = (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
               *)err;
  local_6b0 = warn;
  local_690._M_impl.super__Rb_tree_header._M_header._M_right =
       local_690._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar11 = anon_unknown_0::ReconstructGPrimProperties
                     (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_690,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)properties,&mesh->super_GPrim,warn,err,options->strict_allowedToken_check);
  if (bVar11) {
    p_Var18 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_220 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar23 = p_Var18 == local_220;
    if (!bVar23) {
      local_660 = &mesh->skeleton;
      local_228 = (pointer)&mesh->points;
      local_230 = (pointer)&mesh->normals;
      local_238 = (pointer)&mesh->faceVertexCounts;
      local_240 = (string *)&mesh->faceVertexIndices;
      local_250 = (_Base_ptr)&mesh->cornerIndices;
      local_258 = (_Base_ptr)&mesh->cornerSharpnesses;
      local_260 = (string *)&mesh->creaseIndices;
      local_268 = (string *)&mesh->creaseLengths;
      local_288._24_8_ = &mesh->creaseSharpnesses;
      local_288._16_8_ = &mesh->holeIndices;
      local_288._8_8_ = &mesh->blendShapes;
      local_290 = &mesh->subsetFamilyTypeMap;
      local_288.data._0_8_ = (undefined8)&(mesh->super_GPrim).props;
      local_4e0 = &mesh->faceVaryingLinearInterpolation;
      local_4d8 = &mesh->interpolateBoundary;
      local_4d0 = &mesh->subdivisionScheme;
      local_248 = &mesh->blendShapeTargets;
      bVar23 = false;
      do {
        __v = p_Var18 + 1;
        iVar13 = ::std::__cxx11::string::compare((char *)__v);
        if (iVar13 == 0) {
          local_4c8[0x18] = 'l';
          local_4c8._25_2_ = 0x7465;
          local_4c8[0x1b] = 'o';
          local_4c8[0x1c] = 'n';
          local_4c8[0x10] = 's';
          local_4c8[0x11] = 'k';
          local_4c8[0x12] = 'e';
          local_4c8[0x13] = 'l';
          local_4c8[0x14] = ':';
          local_4c8[0x15] = 's';
          local_4c8[0x16] = 'k';
          local_4c8[0x17] = 'e';
          local_4c8[8] = true;
          local_4c8._9_3_ = 0;
          local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
          local_4c8[0x1d] = '\0';
          local_4c8._0_8_ = (long)local_4c8 + 0x10;
          cVar17 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_690,(key_type *)local_4c8);
          if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
            operator_delete((void *)local_4c8._0_8_,
                            CONCAT17(local_4c8[0x17],
                                     CONCAT16(local_4c8[0x16],
                                              CONCAT15(local_4c8[0x15],
                                                       CONCAT14(local_4c8[0x14],
                                                                CONCAT13(local_4c8[0x13],
                                                                         CONCAT12(local_4c8[0x12],
                                                                                  CONCAT11(local_4c8
                                                  [0x11],local_4c8[0x10]))))))) + 1);
          }
          iVar13 = 3;
          if ((_Rb_tree_header *)cVar17._M_node == &local_690._M_impl.super__Rb_tree_header) {
            if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              paVar3 = &local_700.field_2;
              if (*(uint *)&p_Var18[0x17]._M_left < 4) {
                switch(*(uint *)&p_Var18[0x17]._M_left) {
                default:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_660,(Relationship *)&p_Var18[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_690,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                  iVar13 = 0;
                  bVar11 = true;
                  goto LAB_00217088;
                case 2:
                  if ((long)p_Var18[0x1e]._M_left - (long)p_Var18[0x1e]._M_parent != 0xd0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"():",3);
                    poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe65);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                    local_6d8._M_dataplus._M_p = (pointer)0x3f;
                    local_700._M_dataplus._M_p = (pointer)paVar3;
                    local_700._M_dataplus._M_p =
                         (pointer)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_700,(ulong)&local_6d8);
                    *(undefined8 *)local_700._M_dataplus._M_p = 0x72617420607d7b60;
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 8),"get is e",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x10),"mpty or ",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x18),"has muti",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x20),"ple Path",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x28),"s. Must ",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x2f)," be sing",8);
                    builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x37),"le Path.",8);
                    goto LAB_00216f0d;
                  }
                case 1:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_660,(Relationship *)&p_Var18[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_690,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __v);
                  iVar13 = 3;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe65);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                local_6d8._M_dataplus._M_p = (pointer)0x3a;
                local_700._M_dataplus._M_p = (pointer)paVar3;
                local_700._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create
                                        ((ulong *)&local_700,(ulong)&local_6d8);
                *(undefined8 *)local_700._M_dataplus._M_p = 0x6c616e7265746e49;
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 8)," error. ",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x10),"Property",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x18)," `{}` is",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x20)," not a v",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x28),"alid Rel",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x2a),"id Relat",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x32),"ionship.",8);
LAB_00216f0d:
                local_700._M_string_length = (size_type)local_6d8._M_dataplus._M_p;
                *(char *)((long)local_700._M_dataplus._M_p + (long)local_6d8._M_dataplus._M_p) =
                     '\0';
                local_700.field_2._M_allocated_capacity = (size_type)local_6d8._M_dataplus._M_p;
                fmt::format<char_const*>
                          ((string *)local_658,(fmt *)&local_700,(string *)&kSkelSkeleton,
                           (char **)local_6d8._M_dataplus._M_p);
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,(char *)local_658._0_8_,local_658._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                if (local_658._0_8_ != (long)local_658 + 0x10) {
                  operator_delete((void *)local_658._0_8_,(ulong)(local_658._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_700._M_dataplus._M_p != paVar3) {
                  operator_delete(local_700._M_dataplus._M_p,
                                  (ulong)(local_700.field_2._M_allocated_capacity + 1));
                }
                if (local_6e0 !=
                    (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                     *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  poVar16 = (optional<unsigned_int> *)
                            ::std::__cxx11::string::_M_append
                                      ((char *)&local_700,(ulong)(local_6e0->_metas).interpolation);
                  oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                  if (*poVar16 == oVar1) {
                    local_658._16_8_ = *(undefined8 *)oVar1;
                    aaStack_640[0]._0_8_ = poVar16[3];
                    local_658._0_8_ = (long)local_658 + 0x10;
                  }
                  else {
                    local_658._16_8_ = *(undefined8 *)oVar1;
                    local_658._0_8_ = *poVar16;
                  }
                  local_658._8_8_ = poVar16[1];
                  *poVar16 = oVar1;
                  poVar16[1].has_value_ = false;
                  *(undefined3 *)&poVar16[1].field_0x1 = 0;
                  poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                  poVar16[2].has_value_ = false;
                  ::std::__cxx11::string::operator=((string *)local_6e0,(string *)local_658);
                  if (local_658._0_8_ != (long)local_658 + 0x10) {
                    operator_delete((void *)local_658._0_8_,(ulong)(local_658._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_700._M_dataplus._M_p != paVar3) {
                    operator_delete(local_700._M_dataplus._M_p,
                                    (ulong)(local_700.field_2._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                iVar13 = 1;
              }
              bVar11 = false;
LAB_00217088:
              if (bVar11) goto LAB_00215a79;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
              poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe65);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
              local_6d8._M_dataplus._M_p = (pointer)0x25;
              local_700._M_dataplus._M_p =
                   (pointer)::std::__cxx11::string::_M_create((ulong *)&local_700,(ulong)&local_6d8)
              ;
              *(undefined8 *)local_700._M_dataplus._M_p = 0x79747265706f7250;
              builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 8)," `{}` mu",8);
              builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x10),"st be a ",8);
              builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x18),"Relation",8);
              builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x1d),"ionship.",8);
              *(char *)((long)local_700._M_dataplus._M_p + (long)local_6d8._M_dataplus._M_p) = '\0';
              in = &kSkelSkeleton;
LAB_0021611a:
              local_700._M_string_length = (size_type)local_6d8._M_dataplus._M_p;
              local_700.field_2._M_allocated_capacity = (size_type)local_6d8._M_dataplus._M_p;
              fmt::format<char_const*>
                        ((string *)local_658,(fmt *)&local_700,(string *)in,
                         (char **)local_6d8._M_dataplus._M_p);
              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,(char *)local_658._0_8_,local_658._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
              oVar1 = (optional<unsigned_int>)((long)local_658 + 0x10);
              if ((optional<unsigned_int>)local_658._0_8_ != oVar1) {
                operator_delete((void *)local_658._0_8_,(ulong)(local_658._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_700._M_dataplus._M_p != &local_700.field_2) {
                operator_delete(local_700._M_dataplus._M_p,
                                (ulong)(local_700.field_2._M_allocated_capacity + 1));
              }
              if (local_6e0 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                   *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar16 = (optional<unsigned_int> *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_700,(ulong)(local_6e0->_metas).interpolation);
                oVar2 = (optional<unsigned_int>)(poVar16 + 2);
                if (*poVar16 == oVar2) {
                  local_658._16_8_ = *(undefined8 *)oVar2;
                  aaStack_640[0]._0_8_ = poVar16[3];
                  local_658._0_8_ = oVar1;
                }
                else {
                  local_658._16_8_ = *(undefined8 *)oVar2;
                  local_658._0_8_ = *poVar16;
                }
                local_658._8_8_ = poVar16[1];
                *poVar16 = oVar2;
                poVar16[1].has_value_ = false;
                *(undefined3 *)&poVar16[1].field_0x1 = 0;
                poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                poVar16[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)local_6e0,(string *)local_658);
                if ((optional<unsigned_int>)local_658._0_8_ != oVar1) {
                  operator_delete((void *)local_658._0_8_,(ulong)(local_658._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_700._M_dataplus._M_p != &local_700.field_2) {
                  operator_delete(local_700._M_dataplus._M_p,
                                  (ulong)(local_700.field_2._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
              ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
              iVar13 = 1;
            }
          }
        }
        else {
LAB_00215a79:
          iVar13 = ::std::__cxx11::string::compare((char *)__v);
          if (iVar13 == 0) {
            local_658[0] = true;
            local_658._1_3_ = 0;
            local_658._4_4_ = (storage_t<unsigned_int>)0x0;
            local_4c8._0_8_ = (long)local_4c8 + 0x10;
            local_4c8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)local_658)
            ;
            local_4c8[0x10] = (undefined1)local_658._0_8_;
            local_4c8[0x11] = SUB81(local_658._0_8_,1);
            local_4c8[0x12] = SUB81(local_658._0_8_,2);
            local_4c8[0x13] = SUB81(local_658._0_8_,3);
            local_4c8[0x14] = SUB81(local_658._0_8_,4);
            local_4c8[0x15] = SUB81(local_658._0_8_,5);
            local_4c8[0x16] = SUB81(local_658._0_8_,6);
            local_4c8[0x17] = SUB81(local_658._0_8_,7);
            *(undefined8 *)local_4c8._0_8_ = 0x656c623a6c656b73;
            builtin_strncpy((char *)(local_4c8._0_8_ + 8),"ndShapeT",8);
            builtin_strncpy((char *)(local_4c8._0_8_ + 0xe),"eTargets",8);
            local_4c8._8_8_ = local_658._0_8_;
            *(char *)(local_4c8._0_8_ + local_658._0_8_) = '\0';
            cVar17 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_690,(key_type *)local_4c8);
            if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
              operator_delete((void *)local_4c8._0_8_,
                              CONCAT17(local_4c8[0x17],
                                       CONCAT16(local_4c8[0x16],
                                                CONCAT15(local_4c8[0x15],
                                                         CONCAT14(local_4c8[0x14],
                                                                  CONCAT13(local_4c8[0x13],
                                                                           CONCAT12(local_4c8[0x12],
                                                                                    CONCAT11(
                                                  local_4c8[0x11],local_4c8[0x10]))))))) + 1);
            }
            iVar13 = 3;
            if ((_Rb_tree_header *)cVar17._M_node == &local_690._M_impl.super__Rb_tree_header) {
              if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe66);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
                local_6d8._M_dataplus._M_p = (pointer)0x1b;
                local_700._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create
                                        ((ulong *)&local_700,(ulong)&local_6d8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0xb),"e a Rela",8);
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 0x13),"tionship",8);
                *(undefined8 *)local_700._M_dataplus._M_p = 0x73756d20607d7b60;
                builtin_strncpy((char *)((long)local_700._M_dataplus._M_p + 8),"t be a R",8);
                *(char *)((long)local_700._M_dataplus._M_p + (long)local_6d8._M_dataplus._M_p) =
                     '\0';
                in = &kSkelBlendShapeTargets;
                goto LAB_0021611a;
              }
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        (local_248,(Relationship *)&p_Var18[0x17]._M_left);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_690,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
            }
          }
          else {
            local_b8._M_allocated_capacity = (size_type)local_a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_c8 + 0x10),*(long *)(p_Var18 + 1),
                       (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
            local_6b8 = (Property *)(p_Var18 + 2);
            local_4c8[0x14] = 't';
            local_4c8[0x15] = 's';
            local_4c8[0x10] = 'p';
            local_4c8[0x11] = 'o';
            local_4c8[0x12] = 'i';
            local_4c8[0x13] = 'n';
            local_4c8[8] = true;
            local_4c8._9_3_ = 0;
            local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
            local_4c8[0x16] = '\0';
            pPVar22 = (Property *)local_4c8;
            local_4c8._0_8_ = (long)local_4c8 + 0x10;
            (anonymous_namespace)::
            ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_c8 + 0x10),(string *)local_6b8,(Property *)local_4c8,
                       &local_228->value,target);
            if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
              operator_delete((void *)local_4c8._0_8_,
                              CONCAT17(local_4c8[0x17],
                                       CONCAT16(local_4c8[0x16],
                                                CONCAT15(local_4c8[0x15],
                                                         CONCAT14(local_4c8[0x14],
                                                                  CONCAT13(local_4c8[0x13],
                                                                           CONCAT12(local_4c8[0x12],
                                                                                    CONCAT11(
                                                  local_4c8[0x11],local_4c8[0x10]))))))) + 1);
            }
            if ((undefined8 *)local_b8._M_allocated_capacity != local_a8) {
              operator_delete((void *)local_b8._M_allocated_capacity,local_a8[0] + 1);
            }
            iVar13 = 0;
            if ((local_658._0_8_ & 0xfffffffd) == 0) {
              iVar13 = 3;
LAB_00216271:
              bVar11 = false;
            }
            else {
              bVar11 = true;
              if (local_658._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4c8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3);
                poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe67);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                paVar3 = &local_6d8.field_2;
                local_6a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                local_6d8._M_dataplus._M_p = (pointer)paVar3;
                local_6d8._M_dataplus._M_p =
                     (pointer)::std::__cxx11::string::_M_create
                                        ((ulong *)&local_6d8,(ulong)&local_6a8);
                local_6d8.field_2._M_allocated_capacity =
                     (size_type)
                     local_6a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",8);
                builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),"e `{}` f",8);
                builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),"ailed. E",8);
                builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),"rror: {}",8);
                local_6d8._M_string_length =
                     (size_type)
                     local_6a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                *(char *)((long)&((local_6a8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         (long)local_6d8._M_dataplus._M_p) = '\0';
                fmt::format<char[7],std::__cxx11::string>
                          (&local_700,(fmt *)&local_6d8,(string *)"points",
                           (char (*) [7])(local_658 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar22);
                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                     local_700._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                paVar4 = &local_700.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_700._M_dataplus._M_p != paVar4) {
                  operator_delete(local_700._M_dataplus._M_p,
                                  (ulong)(local_700.field_2._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_6d8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_6d8._M_dataplus._M_p,
                                  (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                }
                if (local_6e0 !=
                    (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                     *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  poVar16 = (optional<unsigned_int> *)
                            ::std::__cxx11::string::_M_append
                                      ((char *)&local_6d8,(ulong)(local_6e0->_metas).interpolation);
                  oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                  if (*poVar16 == oVar1) {
                    local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                    local_700.field_2._8_8_ = poVar16[3];
                    local_700._M_dataplus._M_p = (pointer)paVar4;
                  }
                  else {
                    local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                    local_700._M_dataplus._M_p = (pointer)*poVar16;
                  }
                  local_700._M_string_length = *(size_type *)(poVar16 + 1);
                  *poVar16 = oVar1;
                  poVar16[1].has_value_ = false;
                  *(undefined3 *)&poVar16[1].field_0x1 = 0;
                  poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                  poVar16[2].has_value_ = false;
                  ::std::__cxx11::string::operator=((string *)local_6e0,(string *)&local_700);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_700._M_dataplus._M_p != paVar4) {
                    operator_delete(local_700._M_dataplus._M_p,
                                    (ulong)(local_700.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6d8._M_dataplus._M_p != paVar3) {
                    operator_delete(local_6d8._M_dataplus._M_p,
                                    (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                iVar13 = 1;
                goto LAB_00216271;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_658._8_8_ != aaStack_640) {
              operator_delete((void *)local_658._8_8_,
                              (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
            }
            if (bVar11) {
              local_d8._M_allocated_capacity = (size_type)(local_128 + 0x60);
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_128 + 0x50),*(long *)(p_Var18 + 1),
                         (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
              local_4c8[0x14] = 'a';
              local_4c8[0x15] = 'l';
              local_4c8[0x16] = 's';
              local_4c8[0x10] = 'n';
              local_4c8[0x11] = 'o';
              local_4c8[0x12] = 'r';
              local_4c8[0x13] = 'm';
              local_4c8[8] = true;
              local_4c8._9_3_ = 0;
              local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
              local_4c8[0x17] = '\0';
              pPVar22 = (Property *)local_4c8;
              local_4c8._0_8_ = (long)local_4c8 + 0x10;
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                        ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_128 + 0x50),(string *)local_6b8,(Property *)local_4c8,
                         &local_230->value,
                         (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          *)target);
              if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                operator_delete((void *)local_4c8._0_8_,
                                CONCAT17(local_4c8[0x17],
                                         CONCAT16(local_4c8[0x16],
                                                  CONCAT15(local_4c8[0x15],
                                                           CONCAT14(local_4c8[0x14],
                                                                    CONCAT13(local_4c8[0x13],
                                                                             CONCAT12(local_4c8[0x12
                                                  ],CONCAT11(local_4c8[0x11],local_4c8[0x10])))))))
                                + 1);
              }
              if ((undefined1 *)local_d8._M_allocated_capacity != local_128 + 0x60) {
                operator_delete((void *)local_d8._M_allocated_capacity,local_c8._0_8_ + 1);
              }
              iVar13 = 0;
              if ((local_658._0_8_ & 0xfffffffd) == 0) {
                iVar13 = 3;
LAB_00216662:
                bVar11 = false;
              }
              else {
                bVar11 = true;
                if (local_658._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_4c8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,"():",3)
                  ;
                  poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe68);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                  paVar3 = &local_6d8.field_2;
                  local_6a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                  local_6d8._M_dataplus._M_p = (pointer)paVar3;
                  local_6d8._M_dataplus._M_p =
                       (pointer)::std::__cxx11::string::_M_create
                                          ((ulong *)&local_6d8,(ulong)&local_6a8);
                  local_6d8.field_2._M_allocated_capacity =
                       (size_type)
                       local_6a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                  builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",8);
                  builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),"e `{}` f",8);
                  builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),"ailed. E",8);
                  builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),"rror: {}",8);
                  local_6d8._M_string_length =
                       (size_type)
                       local_6a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  *(char *)((long)&((local_6a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           (long)local_6d8._M_dataplus._M_p) = '\0';
                  fmt::format<char[8],std::__cxx11::string>
                            (&local_700,(fmt *)&local_6d8,(string *)"normals",
                             (char (*) [8])(local_658 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar22);
                  poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                       local_700._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                  paVar4 = &local_700.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_700._M_dataplus._M_p != paVar4) {
                    operator_delete(local_700._M_dataplus._M_p,
                                    (ulong)(local_700.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_6d8._M_dataplus._M_p != paVar3) {
                    operator_delete(local_6d8._M_dataplus._M_p,
                                    (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                  }
                  if (local_6e0 !=
                      (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                       *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    poVar16 = (optional<unsigned_int> *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_6d8,(ulong)(local_6e0->_metas).interpolation
                                        );
                    oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                    if (*poVar16 == oVar1) {
                      local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                      local_700.field_2._8_8_ = poVar16[3];
                      local_700._M_dataplus._M_p = (pointer)paVar4;
                    }
                    else {
                      local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                      local_700._M_dataplus._M_p = (pointer)*poVar16;
                    }
                    local_700._M_string_length = *(size_type *)(poVar16 + 1);
                    *poVar16 = oVar1;
                    poVar16[1].has_value_ = false;
                    *(undefined3 *)&poVar16[1].field_0x1 = 0;
                    poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                    poVar16[2].has_value_ = false;
                    ::std::__cxx11::string::operator=((string *)local_6e0,(string *)&local_700);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_700._M_dataplus._M_p != paVar4) {
                      operator_delete(local_700._M_dataplus._M_p,
                                      (ulong)(local_700.field_2._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6d8._M_dataplus._M_p != paVar3) {
                      operator_delete(local_6d8._M_dataplus._M_p,
                                      (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                  ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                  iVar13 = 1;
                  goto LAB_00216662;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_658._8_8_ != aaStack_640) {
                operator_delete((void *)local_658._8_8_,
                                (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
              }
              if (bVar11) {
                local_f8._M_allocated_capacity = (size_type)(local_128 + 0x40);
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_128 + 0x30),*(long *)(p_Var18 + 1),
                           (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
                local_700._M_dataplus._M_p = (pointer)0x10;
                local_4c8._0_8_ = (long)local_4c8 + 0x10;
                local_4c8._0_8_ =
                     ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)&local_700);
                local_4c8[0x10] = SUB81(local_700._M_dataplus._M_p,0);
                local_4c8[0x11] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 8);
                local_4c8[0x12] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x10);
                local_4c8[0x13] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x18);
                local_4c8[0x14] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x20);
                local_4c8[0x15] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x28);
                local_4c8[0x16] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x30);
                local_4c8[0x17] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x38);
                *(undefined8 *)local_4c8._0_8_ = 0x7472655665636166;
                builtin_strncpy((char *)(local_4c8._0_8_ + 8),"exCounts",8);
                local_4c8._8_8_ = local_700._M_dataplus._M_p;
                *(char *)(local_4c8._0_8_ + (long)local_700._M_dataplus._M_p) = '\0';
                pPVar22 = (Property *)local_4c8;
                (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                          ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(local_128 + 0x30),(string *)local_6b8,(Property *)local_4c8,
                           &local_238->value,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                            *)target);
                if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                  operator_delete((void *)local_4c8._0_8_,
                                  CONCAT17(local_4c8[0x17],
                                           CONCAT16(local_4c8[0x16],
                                                    CONCAT15(local_4c8[0x15],
                                                             CONCAT14(local_4c8[0x14],
                                                                      CONCAT13(local_4c8[0x13],
                                                                               CONCAT12(local_4c8[
                                                  0x12],CONCAT11(local_4c8[0x11],local_4c8[0x10]))))
                                                  ))) + 1);
                }
                if ((undefined1 *)local_f8._M_allocated_capacity != local_128 + 0x40) {
                  operator_delete((void *)local_f8._M_allocated_capacity,local_e8._0_8_ + 1);
                }
                iVar13 = 0;
                if ((local_658._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_00216b19:
                  bVar11 = false;
                }
                else {
                  bVar11 = true;
                  if (local_658._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4c8,"():",3);
                    poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6a);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                    paVar3 = &local_6d8.field_2;
                    local_6a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                    local_6d8._M_dataplus._M_p = (pointer)paVar3;
                    local_6d8._M_dataplus._M_p =
                         (pointer)::std::__cxx11::string::_M_create
                                            ((ulong *)&local_6d8,(ulong)&local_6a8);
                    local_6d8.field_2._M_allocated_capacity =
                         (size_type)
                         local_6a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                    builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",8);
                    builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),"e `{}` f",8);
                    builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),"ailed. E",8);
                    builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),"rror: {}",8);
                    local_6d8._M_string_length =
                         (size_type)
                         local_6a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    *(char *)((long)&((local_6a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + (long)local_6d8._M_dataplus._M_p) = '\0';
                    fmt::format<char[17],std::__cxx11::string>
                              (&local_700,(fmt *)&local_6d8,(string *)"faceVertexCounts",
                               (char (*) [17])(local_658 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar22);
                    poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                         local_700._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                    paVar4 = &local_700.field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_700._M_dataplus._M_p != paVar4) {
                      operator_delete(local_700._M_dataplus._M_p,
                                      (ulong)(local_700.field_2._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6d8._M_dataplus._M_p != paVar3) {
                      operator_delete(local_6d8._M_dataplus._M_p,
                                      (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                    }
                    if (local_6e0 !=
                        (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                         *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      poVar16 = (optional<unsigned_int> *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_6d8,
                                           (ulong)(local_6e0->_metas).interpolation);
                      oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                      if (*poVar16 == oVar1) {
                        local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                        local_700.field_2._8_8_ = poVar16[3];
                        local_700._M_dataplus._M_p = (pointer)paVar4;
                      }
                      else {
                        local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                        local_700._M_dataplus._M_p = (pointer)*poVar16;
                      }
                      local_700._M_string_length = *(size_type *)(poVar16 + 1);
                      *poVar16 = oVar1;
                      poVar16[1].has_value_ = false;
                      *(undefined3 *)&poVar16[1].field_0x1 = 0;
                      poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                      poVar16[2].has_value_ = false;
                      ::std::__cxx11::string::operator=((string *)local_6e0,(string *)&local_700);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_700._M_dataplus._M_p != paVar4) {
                        operator_delete(local_700._M_dataplus._M_p,
                                        (ulong)(local_700.field_2._M_allocated_capacity + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_6d8._M_dataplus._M_p != paVar3) {
                        operator_delete(local_6d8._M_dataplus._M_p,
                                        (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                    ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                    iVar13 = 1;
                    goto LAB_00216b19;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._8_8_ != aaStack_640) {
                  operator_delete((void *)local_658._8_8_,
                                  (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                }
                if (bVar11) {
                  local_118._M_allocated_capacity = (long)local_128 + 0x20;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)(local_128 + 0x10),*(long *)(p_Var18 + 1),
                             (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
                  local_700._M_dataplus._M_p = (pointer)0x11;
                  local_4c8._0_8_ = (long)local_4c8 + 0x10;
                  local_4c8._0_8_ =
                       ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)&local_700);
                  local_4c8[0x10] = SUB81(local_700._M_dataplus._M_p,0);
                  local_4c8[0x11] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 8);
                  local_4c8[0x12] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x10);
                  local_4c8[0x13] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x18);
                  local_4c8[0x14] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x20);
                  local_4c8[0x15] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x28);
                  local_4c8[0x16] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x30);
                  local_4c8[0x17] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x38);
                  *(undefined8 *)local_4c8._0_8_ = 0x7472655665636166;
                  builtin_strncpy((char *)(local_4c8._0_8_ + 8),"exIndice",8);
                  *(char *)(local_4c8._0_8_ + 0x10) = 's';
                  local_4c8._8_8_ = local_700._M_dataplus._M_p;
                  *(char *)(local_4c8._0_8_ + (long)local_700._M_dataplus._M_p) = '\0';
                  pPVar22 = (Property *)local_4c8;
                  (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                            ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_128 + 0x10),(string *)local_6b8,(Property *)local_4c8,
                             local_240,
                             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                              *)target);
                  if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                    operator_delete((void *)local_4c8._0_8_,
                                    CONCAT17(local_4c8[0x17],
                                             CONCAT16(local_4c8[0x16],
                                                      CONCAT15(local_4c8[0x15],
                                                               CONCAT14(local_4c8[0x14],
                                                                        CONCAT13(local_4c8[0x13],
                                                                                 CONCAT12(local_4c8[
                                                  0x12],CONCAT11(local_4c8[0x11],local_4c8[0x10]))))
                                                  ))) + 1);
                  }
                  if (local_118._M_allocated_capacity != (long)local_128 + 0x20) {
                    operator_delete((void *)local_118._M_allocated_capacity,
                                    (ulong)(local_108._M_p + 1));
                  }
                  iVar13 = 0;
                  if ((local_658._0_8_ & 0xfffffffd) == 0) {
                    iVar13 = 3;
LAB_0021711a:
                    bVar11 = false;
                  }
                  else {
                    bVar11 = true;
                    if (local_658._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4c8,"():",3);
                      poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6c);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                      paVar3 = &local_6d8.field_2;
                      local_6a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                      local_6d8._M_dataplus._M_p = (pointer)paVar3;
                      local_6d8._M_dataplus._M_p =
                           (pointer)::std::__cxx11::string::_M_create
                                              ((ulong *)&local_6d8,(ulong)&local_6a8);
                      local_6d8.field_2._M_allocated_capacity =
                           (size_type)
                           local_6a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                      builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",8);
                      builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),"e `{}` f",8
                                     );
                      builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),"ailed. E",8
                                     );
                      builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),"rror: {}",8
                                     );
                      local_6d8._M_string_length =
                           (size_type)
                           local_6a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      *(char *)((long)&((local_6a8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + (long)local_6d8._M_dataplus._M_p) = '\0';
                      fmt::format<char[18],std::__cxx11::string>
                                (&local_700,(fmt *)&local_6d8,(string *)"faceVertexIndices",
                                 (char (*) [18])(local_658 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar22);
                      poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                           local_700._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                      paVar4 = &local_700.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_700._M_dataplus._M_p != paVar4) {
                        operator_delete(local_700._M_dataplus._M_p,
                                        (ulong)(local_700.field_2._M_allocated_capacity + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_6d8._M_dataplus._M_p != paVar3) {
                        operator_delete(local_6d8._M_dataplus._M_p,
                                        (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                      }
                      if (local_6e0 !=
                          (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                           *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        poVar16 = (optional<unsigned_int> *)
                                  ::std::__cxx11::string::_M_append
                                            ((char *)&local_6d8,
                                             (ulong)(local_6e0->_metas).interpolation);
                        oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                        if (*poVar16 == oVar1) {
                          local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                          local_700.field_2._8_8_ = poVar16[3];
                          local_700._M_dataplus._M_p = (pointer)paVar4;
                        }
                        else {
                          local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                          local_700._M_dataplus._M_p = (pointer)*poVar16;
                        }
                        local_700._M_string_length = *(size_type *)(poVar16 + 1);
                        *poVar16 = oVar1;
                        poVar16[1].has_value_ = false;
                        *(undefined3 *)&poVar16[1].field_0x1 = 0;
                        poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                        poVar16[2].has_value_ = false;
                        ::std::__cxx11::string::operator=((string *)local_6e0,(string *)&local_700);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_700._M_dataplus._M_p != paVar4) {
                          operator_delete(local_700._M_dataplus._M_p,
                                          (ulong)(local_700.field_2._M_allocated_capacity + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6d8._M_dataplus._M_p != paVar3) {
                          operator_delete(local_6d8._M_dataplus._M_p,
                                          (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                      ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                      iVar13 = 1;
                      goto LAB_0021711a;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_658._8_8_ != aaStack_640) {
                    operator_delete((void *)local_658._8_8_,
                                    (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                  }
                  if (bVar11) {
                    local_138[0] = (pointer)local_128;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_138,*(long *)(p_Var18 + 1),
                               (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
                    local_4c8[0x18] = 'd';
                    local_4c8._25_2_ = 0x6369;
                    local_4c8[0x1b] = 'e';
                    local_4c8[0x1c] = 's';
                    local_4c8[0x10] = 'c';
                    local_4c8[0x11] = 'o';
                    local_4c8[0x12] = 'r';
                    local_4c8[0x13] = 'n';
                    local_4c8[0x14] = 'e';
                    local_4c8[0x15] = 'r';
                    local_4c8[0x16] = 'I';
                    local_4c8[0x17] = 'n';
                    local_4c8[8] = true;
                    local_4c8._9_3_ = 0;
                    local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                    local_4c8[0x1d] = '\0';
                    pPVar22 = (Property *)local_4c8;
                    local_4c8._0_8_ = (long)local_4c8 + 0x10;
                    (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                              ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_138,(string *)local_6b8,(Property *)local_4c8,
                               (string *)local_250,
                               (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                *)target);
                    if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                      operator_delete((void *)local_4c8._0_8_,
                                      CONCAT17(local_4c8[0x17],
                                               CONCAT16(local_4c8[0x16],
                                                        CONCAT15(local_4c8[0x15],
                                                                 CONCAT14(local_4c8[0x14],
                                                                          CONCAT13(local_4c8[0x13],
                                                                                   CONCAT12(
                                                  local_4c8[0x12],
                                                  CONCAT11(local_4c8[0x11],local_4c8[0x10]))))))) +
                                      1);
                    }
                    if (local_138[0] != (pointer)local_128) {
                      operator_delete(local_138[0],(ulong)(local_128._0_8_ + 1));
                    }
                    iVar13 = 0;
                    if ((local_658._0_8_ & 0xfffffffd) == 0) {
                      iVar13 = 3;
LAB_00217483:
                      bVar11 = false;
                    }
                    else {
                      bVar11 = true;
                      if (local_658._0_4_ != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4c8,"():",3);
                        poVar15 = (ostream *)::std::ostream::operator<<((Property *)local_4c8,0xe6f)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                        paVar3 = &local_6d8.field_2;
                        local_6a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                        local_6d8._M_dataplus._M_p = (pointer)paVar3;
                        local_6d8._M_dataplus._M_p =
                             (pointer)::std::__cxx11::string::_M_create
                                                ((ulong *)&local_6d8,(ulong)&local_6a8);
                        local_6d8.field_2._M_allocated_capacity =
                             (size_type)
                             local_6a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                        *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                        builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",8)
                        ;
                        builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),"e `{}` f"
                                        ,8);
                        builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),"ailed. E"
                                        ,8);
                        builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),"rror: {}"
                                        ,8);
                        local_6d8._M_string_length =
                             (size_type)
                             local_6a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                        *(char *)((long)&((local_6a8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + (long)local_6d8._M_dataplus._M_p) = '\0';
                        fmt::format<char[14],std::__cxx11::string>
                                  (&local_700,(fmt *)&local_6d8,(string *)"cornerIndices",
                                   (char (*) [14])(local_658 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar22);
                        poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                             local_700._M_string_length);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                        paVar4 = &local_700.field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_700._M_dataplus._M_p != paVar4) {
                          operator_delete(local_700._M_dataplus._M_p,
                                          (ulong)(local_700.field_2._M_allocated_capacity + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6d8._M_dataplus._M_p != paVar3) {
                          operator_delete(local_6d8._M_dataplus._M_p,
                                          (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                        }
                        if (local_6e0 !=
                            (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                             *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          poVar16 = (optional<unsigned_int> *)
                                    ::std::__cxx11::string::_M_append
                                              ((char *)&local_6d8,
                                               (ulong)(local_6e0->_metas).interpolation);
                          oVar1 = (optional<unsigned_int>)(poVar16 + 2);
                          if (*poVar16 == oVar1) {
                            local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                            local_700.field_2._8_8_ = poVar16[3];
                            local_700._M_dataplus._M_p = (pointer)paVar4;
                          }
                          else {
                            local_700.field_2._M_allocated_capacity = *(undefined8 *)oVar1;
                            local_700._M_dataplus._M_p = (pointer)*poVar16;
                          }
                          local_700._M_string_length = *(size_type *)(poVar16 + 1);
                          *poVar16 = oVar1;
                          poVar16[1].has_value_ = false;
                          *(undefined3 *)&poVar16[1].field_0x1 = 0;
                          poVar16[1].contained = (storage_t<unsigned_int>)0x0;
                          poVar16[2].has_value_ = false;
                          ::std::__cxx11::string::operator=
                                    ((string *)local_6e0,(string *)&local_700);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_700._M_dataplus._M_p != paVar4) {
                            operator_delete(local_700._M_dataplus._M_p,
                                            (ulong)(local_700.field_2._M_allocated_capacity + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_6d8._M_dataplus._M_p != paVar3) {
                            operator_delete(local_6d8._M_dataplus._M_p,
                                            (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                        ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                        iVar13 = 1;
                        goto LAB_00217483;
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_658._8_8_ != aaStack_640) {
                      operator_delete((void *)local_658._8_8_,
                                      (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                    }
                    if (bVar11) {
                      local_158._0_8_ = local_148;
                      ::std::__cxx11::string::_M_construct<char*>
                                (local_158,*(long *)(p_Var18 + 1),
                                 (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
                      local_700._M_dataplus._M_p = (pointer)0x11;
                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                      local_4c8._0_8_ =
                           ::std::__cxx11::string::_M_create((ulong *)local_4c8,(ulong)&local_700);
                      local_4c8[0x10] = SUB81(local_700._M_dataplus._M_p,0);
                      local_4c8[0x11] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 8);
                      local_4c8[0x12] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x10);
                      local_4c8[0x13] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x18);
                      local_4c8[0x14] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x20);
                      local_4c8[0x15] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x28);
                      local_4c8[0x16] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x30);
                      local_4c8[0x17] = (undefined1)((ulong)local_700._M_dataplus._M_p >> 0x38);
                      *(undefined8 *)local_4c8._0_8_ = 0x685372656e726f63;
                      builtin_strncpy((char *)(local_4c8._0_8_ + 8),"arpnesse",8);
                      *(char *)(local_4c8._0_8_ + 0x10) = 's';
                      local_4c8._8_8_ = local_700._M_dataplus._M_p;
                      *(char *)(local_4c8._0_8_ + (long)local_700._M_dataplus._M_p) = '\0';
                      pPVar22 = (Property *)local_4c8;
                      (anonymous_namespace)::
                      ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                                ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_158,(string *)local_6b8,(Property *)local_4c8,
                                 (string *)local_258,
                                 (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                                  *)target);
                      if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                        operator_delete((void *)local_4c8._0_8_,
                                        CONCAT17(local_4c8[0x17],
                                                 CONCAT16(local_4c8[0x16],
                                                          CONCAT15(local_4c8[0x15],
                                                                   CONCAT14(local_4c8[0x14],
                                                                            CONCAT13(local_4c8[0x13]
                                                                                     ,CONCAT12(
                                                  local_4c8[0x12],
                                                  CONCAT11(local_4c8[0x11],local_4c8[0x10]))))))) +
                                        1);
                      }
                      if ((long *)local_158._0_8_ != local_148) {
                        operator_delete((void *)local_158._0_8_,local_148[0] + 1);
                      }
                      iVar13 = 0;
                      if ((local_658._0_8_ & 0xfffffffd) == 0) {
                        iVar13 = 3;
LAB_002177ce:
                        bVar11 = false;
                      }
                      else {
                        bVar11 = true;
                        if (local_658._0_4_ != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4c8,"():",3);
                          poVar15 = (ostream *)
                                    ::std::ostream::operator<<((Property *)local_4c8,0xe71);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                          local_6a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x28;
                          local_6d8._M_dataplus._M_p =
                               (pointer)::std::__cxx11::string::_M_create
                                                  ((ulong *)&local_6d8,(ulong)&local_6a8);
                          local_6d8.field_2._M_allocated_capacity =
                               (size_type)
                               local_6a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                          *(undefined8 *)local_6d8._M_dataplus._M_p = 0x20676e6973726150;
                          builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 8),"attribut",
                                          8);
                          builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x10),
                                          "e `{}` f",8);
                          builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x18),
                                          "ailed. E",8);
                          builtin_strncpy((char *)((long)local_6d8._M_dataplus._M_p + 0x20),
                                          "rror: {}",8);
                          local_6d8._M_string_length =
                               (size_type)
                               local_6a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                          *(char *)((long)&((local_6a8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + (long)local_6d8._M_dataplus._M_p) = '\0';
                          fmt::format<char[18],std::__cxx11::string>
                                    (&local_700,(fmt *)&local_6d8,(string *)"cornerSharpnesses",
                                     (char (*) [18])(local_658 + 8),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar22);
                          poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                               local_700._M_string_length);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                            operator_delete(local_700._M_dataplus._M_p,
                                            (ulong)(local_700.field_2._M_allocated_capacity + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                            operator_delete(local_6d8._M_dataplus._M_p,
                                            (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                          }
                          if (local_6e0 !=
                              (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                               *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            pTVar9 = local_6e0;
                            ::std::operator+(&local_700,&local_6d8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_6e0);
                            ::std::__cxx11::string::operator=((string *)pTVar9,(string *)&local_700)
                            ;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_700._M_dataplus._M_p != &local_700.field_2) {
                              operator_delete(local_700._M_dataplus._M_p,
                                              (ulong)(local_700.field_2._M_allocated_capacity + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                              operator_delete(local_6d8._M_dataplus._M_p,
                                              (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
                          ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                          iVar13 = 1;
                          goto LAB_002177ce;
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_658._8_8_ != aaStack_640) {
                        operator_delete((void *)local_658._8_8_,
                                        (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                      }
                      if (bVar11) {
                        local_178._0_8_ = local_168;
                        ::std::__cxx11::string::_M_construct<char*>
                                  (local_178,*(long *)(p_Var18 + 1),
                                   (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1))
                        ;
                        local_4c8[0x18] = 'd';
                        local_4c8._25_2_ = 0x6369;
                        local_4c8[0x1b] = 'e';
                        local_4c8[0x1c] = 's';
                        local_4c8[0x10] = 'c';
                        local_4c8[0x11] = 'r';
                        local_4c8[0x12] = 'e';
                        local_4c8[0x13] = 'a';
                        local_4c8[0x14] = 's';
                        local_4c8[0x15] = 'e';
                        local_4c8[0x16] = 'I';
                        local_4c8[0x17] = 'n';
                        local_4c8[8] = true;
                        local_4c8._9_3_ = 0;
                        local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                        local_4c8[0x1d] = '\0';
                        pPVar22 = (Property *)local_4c8;
                        local_4c8._0_8_ = (long)local_4c8 + 0x10;
                        (anonymous_namespace)::
                        ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                  ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_178,(string *)local_6b8,(Property *)local_4c8,local_260,
                                   (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                    *)target);
                        if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                          operator_delete((void *)local_4c8._0_8_,
                                          CONCAT17(local_4c8[0x17],
                                                   CONCAT16(local_4c8[0x16],
                                                            CONCAT15(local_4c8[0x15],
                                                                     CONCAT14(local_4c8[0x14],
                                                                              CONCAT13(local_4c8[
                                                  0x13],CONCAT12(local_4c8[0x12],
                                                                 CONCAT11(local_4c8[0x11],
                                                                          local_4c8[0x10]))))))) + 1
                                         );
                        }
                        if ((size_type *)local_178._0_8_ != local_168) {
                          operator_delete((void *)local_178._0_8_,local_168[0] + 1);
                        }
                        iVar13 = 0;
                        if ((local_658._0_8_ & 0xfffffffd) == 0) {
                          iVar13 = 3;
LAB_00217abc:
                          bVar11 = false;
                        }
                        else {
                          bVar11 = true;
                          if (local_658._0_4_ != Unmatched) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_4c8,"():",3);
                            poVar15 = (ostream *)
                                      ::std::ostream::operator<<((Property *)local_4c8,0xe73);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                            local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_6d8,
                                       "Parsing attribute `{}` failed. Error: {}","");
                            fmt::format<char[14],std::__cxx11::string>
                                      (&local_700,(fmt *)&local_6d8,(string *)"creaseIndices",
                                       (char (*) [14])(local_658 + 8),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar22);
                            poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                                 local_700._M_string_length);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_700._M_dataplus._M_p != &local_700.field_2) {
                              operator_delete(local_700._M_dataplus._M_p,
                                              (ulong)(local_700.field_2._M_allocated_capacity + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                              operator_delete(local_6d8._M_dataplus._M_p,
                                              (ulong)(local_6d8.field_2._M_allocated_capacity + 1));
                            }
                            if (local_6e0 !=
                                (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                 *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              pTVar9 = local_6e0;
                              ::std::operator+(&local_700,&local_6d8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_6e0);
                              ::std::__cxx11::string::operator=
                                        ((string *)pTVar9,(string *)&local_700);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                operator_delete(local_700._M_dataplus._M_p,
                                                (ulong)(local_700.field_2._M_allocated_capacity + 1)
                                               );
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                operator_delete(local_6d8._M_dataplus._M_p,
                                                (ulong)(local_6d8.field_2._M_allocated_capacity + 1)
                                               );
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_4c8);
                            ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                            iVar13 = 1;
                            goto LAB_00217abc;
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_658._8_8_ != aaStack_640) {
                          operator_delete((void *)local_658._8_8_,
                                          (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                        }
                        if (bVar11) {
                          local_198._0_8_ = local_188;
                          ::std::__cxx11::string::_M_construct<char*>
                                    (local_198,*(long *)(p_Var18 + 1),
                                     (long)&(p_Var18[1]._M_parent)->_M_color +
                                     *(long *)(p_Var18 + 1));
                          local_4c8[0x18] = 'n';
                          local_4c8._25_2_ = 0x7467;
                          local_4c8[0x1b] = 'h';
                          local_4c8[0x1c] = 's';
                          local_4c8[0x10] = 'c';
                          local_4c8[0x11] = 'r';
                          local_4c8[0x12] = 'e';
                          local_4c8[0x13] = 'a';
                          local_4c8[0x14] = 's';
                          local_4c8[0x15] = 'e';
                          local_4c8[0x16] = 'L';
                          local_4c8[0x17] = 'e';
                          local_4c8[8] = true;
                          local_4c8._9_3_ = 0;
                          local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                          local_4c8[0x1d] = '\0';
                          pPVar22 = (Property *)local_4c8;
                          local_4c8._0_8_ = (long)local_4c8 + 0x10;
                          (anonymous_namespace)::
                          ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                    ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_198,(string *)local_6b8,(Property *)local_4c8,
                                     local_268,
                                     (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                      *)target);
                          if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                            operator_delete((void *)local_4c8._0_8_,
                                            CONCAT17(local_4c8[0x17],
                                                     CONCAT16(local_4c8[0x16],
                                                              CONCAT15(local_4c8[0x15],
                                                                       CONCAT14(local_4c8[0x14],
                                                                                CONCAT13(local_4c8[
                                                  0x13],CONCAT12(local_4c8[0x12],
                                                                 CONCAT11(local_4c8[0x11],
                                                                          local_4c8[0x10]))))))) + 1
                                           );
                          }
                          if ((size_type *)local_198._0_8_ != local_188) {
                            operator_delete((void *)local_198._0_8_,local_188[0] + 1);
                          }
                          iVar13 = 0;
                          if ((local_658._0_8_ & 0xfffffffd) == 0) {
                            iVar13 = 3;
LAB_00217daa:
                            bVar11 = false;
                          }
                          else {
                            bVar11 = true;
                            if (local_658._0_4_ != Unmatched) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_4c8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_4c8,"():",3);
                              poVar15 = (ostream *)
                                        ::std::ostream::operator<<((Property *)local_4c8,0xe75);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                              local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_6d8,
                                         "Parsing attribute `{}` failed. Error: {}","");
                              fmt::format<char[14],std::__cxx11::string>
                                        (&local_700,(fmt *)&local_6d8,(string *)"creaseLengths",
                                         (char (*) [14])(local_658 + 8),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pPVar22);
                              poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,local_700._M_dataplus._M_p,
                                                   local_700._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                operator_delete(local_700._M_dataplus._M_p,
                                                (ulong)(local_700.field_2._M_allocated_capacity + 1)
                                               );
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                operator_delete(local_6d8._M_dataplus._M_p,
                                                (ulong)(local_6d8.field_2._M_allocated_capacity + 1)
                                               );
                              }
                              if (local_6e0 !=
                                  (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                   *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                pTVar9 = local_6e0;
                                ::std::operator+(&local_700,&local_6d8,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                ::std::__cxx11::string::operator=
                                          ((string *)pTVar9,(string *)&local_700);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                  operator_delete(local_700._M_dataplus._M_p,
                                                  (ulong)(local_700.field_2._M_allocated_capacity +
                                                         1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                  operator_delete(local_6d8._M_dataplus._M_p,
                                                  (ulong)(local_6d8.field_2._M_allocated_capacity +
                                                         1));
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_4c8);
                              ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                              iVar13 = 1;
                              goto LAB_00217daa;
                            }
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_658._8_8_ != aaStack_640) {
                            operator_delete((void *)local_658._8_8_,
                                            (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                          }
                          if (bVar11) {
                            local_1b8._0_8_ = local_1a8;
                            ::std::__cxx11::string::_M_construct<char*>
                                      (local_1b8,*(long *)(p_Var18 + 1),
                                       (long)&(p_Var18[1]._M_parent)->_M_color +
                                       *(long *)(p_Var18 + 1));
                            local_4c8._0_8_ = (long)local_4c8 + 0x10;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_4c8,"creaseSharpnesses","");
                            pPVar22 = (Property *)local_4c8;
                            (anonymous_namespace)::
                            ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                                      ((ParseResult *)local_658,(_anonymous_namespace_ *)&local_690,
                                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_1b8,(string *)local_6b8,(Property *)local_4c8,
                                       (string *)local_288._24_8_,
                                       (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                                        *)target);
                            if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                              operator_delete((void *)local_4c8._0_8_,
                                              CONCAT17(local_4c8[0x17],
                                                       CONCAT16(local_4c8[0x16],
                                                                CONCAT15(local_4c8[0x15],
                                                                         CONCAT14(local_4c8[0x14],
                                                                                  CONCAT13(local_4c8
                                                  [0x13],CONCAT12(local_4c8[0x12],
                                                                  CONCAT11(local_4c8[0x11],
                                                                           local_4c8[0x10]))))))) +
                                              1);
                            }
                            if ((size_type *)local_1b8._0_8_ != local_1a8) {
                              operator_delete((void *)local_1b8._0_8_,local_1a8[0] + 1);
                            }
                            iVar13 = 0;
                            if ((local_658._0_8_ & 0xfffffffd) == 0) {
                              iVar13 = 3;
LAB_0021807f:
                              bVar11 = false;
                            }
                            else {
                              bVar11 = true;
                              if (local_658._0_4_ != Unmatched) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_4c8);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           ,0x5a);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_4c8,"():",3);
                                poVar15 = (ostream *)
                                          ::std::ostream::operator<<((Property *)local_4c8,0xe77);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                                local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_6d8,
                                           "Parsing attribute `{}` failed. Error: {}","");
                                fmt::format<char[18],std::__cxx11::string>
                                          (&local_700,(fmt *)&local_6d8,
                                           (string *)"creaseSharpnesses",
                                           (char (*) [18])(local_658 + 8),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)pPVar22);
                                poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,local_700._M_dataplus._M_p
                                                     ,local_700._M_string_length);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1)
                                ;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                  operator_delete(local_700._M_dataplus._M_p,
                                                  (ulong)(local_700.field_2._M_allocated_capacity +
                                                         1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                  operator_delete(local_6d8._M_dataplus._M_p,
                                                  (ulong)(local_6d8.field_2._M_allocated_capacity +
                                                         1));
                                }
                                if (local_6e0 !=
                                    (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                     *)0x0) {
                                  ::std::__cxx11::stringbuf::str();
                                  pTVar9 = local_6e0;
                                  ::std::operator+(&local_700,&local_6d8,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                  ::std::__cxx11::string::operator=
                                            ((string *)pTVar9,(string *)&local_700);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                    operator_delete(local_700._M_dataplus._M_p,
                                                    (ulong)(local_700.field_2._M_allocated_capacity
                                                           + 1));
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                    operator_delete(local_6d8._M_dataplus._M_p,
                                                    (ulong)(local_6d8.field_2._M_allocated_capacity
                                                           + 1));
                                  }
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_4c8);
                                ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                iVar13 = 1;
                                goto LAB_0021807f;
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_658._8_8_ != aaStack_640) {
                              operator_delete((void *)local_658._8_8_,
                                              (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                            }
                            if (bVar11) {
                              local_1d8._0_8_ = local_1c8;
                              ::std::__cxx11::string::_M_construct<char*>
                                        (local_1d8,*(long *)(p_Var18 + 1),
                                         (long)&(p_Var18[1]._M_parent)->_M_color +
                                         *(long *)(p_Var18 + 1));
                              local_4c8[0x10] = 'h';
                              local_4c8[0x11] = 'o';
                              local_4c8[0x12] = 'l';
                              local_4c8[0x13] = 'e';
                              local_4c8[0x14] = 'I';
                              local_4c8[0x15] = 'n';
                              local_4c8[0x16] = 'd';
                              local_4c8[0x17] = 'i';
                              local_4c8[0x18] = 'c';
                              local_4c8._25_2_ = 0x7365;
                              local_4c8[8] = true;
                              local_4c8._9_3_ = 0;
                              local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                              local_4c8[0x1b] = '\0';
                              pPVar22 = (Property *)local_4c8;
                              local_4c8._0_8_ = (long)local_4c8 + 0x10;
                              (anonymous_namespace)::
                              ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                                        ((ParseResult *)local_658,
                                         (_anonymous_namespace_ *)&local_690,
                                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)local_1d8,(string *)local_6b8,(Property *)local_4c8,
                                         (string *)local_288._16_8_,
                                         (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                          *)target);
                              if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                operator_delete((void *)local_4c8._0_8_,
                                                CONCAT17(local_4c8[0x17],
                                                         CONCAT16(local_4c8[0x16],
                                                                  CONCAT15(local_4c8[0x15],
                                                                           CONCAT14(local_4c8[0x14],
                                                                                    CONCAT13(
                                                  local_4c8[0x13],
                                                  CONCAT12(local_4c8[0x12],
                                                           CONCAT11(local_4c8[0x11],local_4c8[0x10])
                                                          )))))) + 1);
                              }
                              if ((size_type *)local_1d8._0_8_ != local_1c8) {
                                operator_delete((void *)local_1d8._0_8_,local_1c8[0] + 1);
                              }
                              iVar13 = 0;
                              if ((local_658._0_8_ & 0xfffffffd) == 0) {
                                iVar13 = 3;
LAB_00218366:
                                bVar11 = false;
                              }
                              else {
                                bVar11 = true;
                                if (local_658._0_4_ != Unmatched) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_4c8);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             ,0x5a);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_4c8,"():",3);
                                  poVar15 = (ostream *)
                                            ::std::ostream::operator<<((Property *)local_4c8,0xe79);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15," ",1);
                                  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_6d8,
                                             "Parsing attribute `{}` failed. Error: {}","");
                                  fmt::format<char[12],std::__cxx11::string>
                                            (&local_700,(fmt *)&local_6d8,(string *)"holeIndices",
                                             (char (*) [12])(local_658 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pPVar22);
                                  poVar15 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)local_4c8,
                                                       local_700._M_dataplus._M_p,
                                                       local_700._M_string_length);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,"\n",1);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                    operator_delete(local_700._M_dataplus._M_p,
                                                    (ulong)(local_700.field_2._M_allocated_capacity
                                                           + 1));
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                    operator_delete(local_6d8._M_dataplus._M_p,
                                                    (ulong)(local_6d8.field_2._M_allocated_capacity
                                                           + 1));
                                  }
                                  if (local_6e0 !=
                                      (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                       *)0x0) {
                                    ::std::__cxx11::stringbuf::str();
                                    pTVar9 = local_6e0;
                                    ::std::operator+(&local_700,&local_6d8,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                    ::std::__cxx11::string::operator=
                                              ((string *)pTVar9,(string *)&local_700);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                      operator_delete(local_700._M_dataplus._M_p,
                                                      (ulong)(local_700.field_2.
                                                              _M_allocated_capacity + 1));
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                      operator_delete(local_6d8._M_dataplus._M_p,
                                                      (ulong)(local_6d8.field_2.
                                                              _M_allocated_capacity + 1));
                                    }
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_4c8);
                                  ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                  iVar13 = 1;
                                  goto LAB_00218366;
                                }
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_658._8_8_ != aaStack_640) {
                                operator_delete((void *)local_658._8_8_,
                                                (ulong)(aaStack_640[0]._M_allocated_capacity + 1));
                              }
                              if (bVar11) {
                                iVar13 = ::std::__cxx11::string::compare((char *)__v);
                                if (iVar13 == 0) {
                                  local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_4c8,"subdivisionScheme","");
                                  cVar17 = ::std::
                                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)local_4c8);
                                  if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                    operator_delete((void *)local_4c8._0_8_,
                                                    CONCAT17(local_4c8[0x17],
                                                             CONCAT16(local_4c8[0x16],
                                                                      CONCAT15(local_4c8[0x15],
                                                                               CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                  }
                                  iVar13 = 3;
                                  if ((_Rb_tree_header *)cVar17._M_node ==
                                      &local_690._M_impl.super__Rb_tree_header) {
                                    if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) ==
                                        0x200000000) {
                                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                      local_4c8[8] = false;
                                      local_4c8._9_3_ = 0;
                                      local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                      local_4c8[0x10] = '\0';
                                    }
                                    else {
                                      Attribute::type_name_abi_cxx11_
                                                ((string *)local_4c8,&local_6b8->_attrib);
                                    }
                                    uVar10 = local_4c8._0_8_;
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    local_658[8] = true;
                                    local_658._9_3_ = 0;
                                    local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_658._16_6_ = 0x6e656b6f74;
                                    if ((((optional<unsigned_int>)local_4c8._8_8_ ==
                                          (optional<unsigned_int>)0x5) &&
                                        (iVar13 = bcmp((void *)local_4c8._0_8_,local_658 + 0x10,5),
                                        iVar13 == 0)) &&
                                       (uVar7 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4),
                                       uVar7 < 2)) {
                                      if (uVar10 != (long)local_4c8 + 0x10) {
                                        operator_delete((void *)uVar10,
                                                        CONCAT17(local_4c8[0x17],
                                                                 CONCAT16(local_4c8[0x16],
                                                                          CONCAT15(local_4c8[0x15],
                                                                                   CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                      }
                                      if (uVar7 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"():",3);
                                        poVar15 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4c8,0xe7c);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," ",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"No value assigned to `",
                                                   0x16);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"subdivisionScheme",0x11);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                   "` token attribute. Set default token value.",
                                                   0x2b);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"\n",1);
                                        if (local_6b0 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_658,&local_700,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_6b0,(string *)local_658);
                                          if (local_658._0_8_ != (long)local_658 + 0x10) {
                                            operator_delete((void *)local_658._0_8_,
                                                            (ulong)(local_658._16_8_ + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                            operator_delete(local_700._M_dataplus._M_p,
                                                            (ulong)(local_700.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                        AttrMetas::operator=
                                                  (&local_4d0->_metas,(AttrMetas *)(p_Var18 + 7));
                                        pcVar21 = "subdivisionScheme";
                                        pcVar20 = "";
LAB_00219555:
                                        iVar13 = 3;
                                        local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                        ::std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_4c8,pcVar21,pcVar20);
                                        ::std::
                                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        ::_M_insert_unique<std::__cxx11::string>
                                                  ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_690,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_4c8);
                                        if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                          operator_delete((void *)local_4c8._0_8_,
                                                          CONCAT17(local_4c8[0x17],
                                                                   CONCAT16(local_4c8[0x16],
                                                                            CONCAT15(local_4c8[0x15]
                                                                                     ,CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                        }
                                        goto LAB_00219751;
                                      }
                                    }
                                    else if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                      operator_delete((void *)local_4c8._0_8_,
                                                      CONCAT17(local_4c8[0x17],
                                                               CONCAT16(local_4c8[0x16],
                                                                        CONCAT15(local_4c8[0x15],
                                                                                 CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                    }
                                    local_4c8[0] = false;
                                    local_4c8._1_3_ = 0;
                                    local_4c8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_4c8[8] = false;
                                    local_4c8._9_3_ = 0;
                                    local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_4c8[0x18] = -0x2c;
                                    local_4c8._25_2_ = 0x24e5;
                                    local_4c8[0x1b] = '\0';
                                    local_4c8[0x1c] = '\0';
                                    local_4c8[0x1d] = '\0';
                                    local_4c8._30_2_ = 0;
                                    local_4c8[0x10] = '\x1a';
                                    local_4c8[0x11] = -0x10;
                                    local_4c8[0x12] = '$';
                                    local_4c8[0x13] = '\0';
                                    local_4c8[0x14] = '\0';
                                    local_4c8[0x15] = '\0';
                                    local_4c8[0x16] = '\0';
                                    local_4c8[0x17] = '\0';
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_658,"subdivisionScheme","");
                                    bVar11 = options->strict_allowedToken_check;
                                    local_58._16_8_ = (code *)0x0;
                                    local_58._24_8_ = 0;
                                    local_58.data.__align =
                                         (anon_struct_8_0_00000001_for___align)0x0;
                                    local_58._8_8_ = 0;
                                    pcVar8 = (code *)CONCAT17(local_4c8[0x17],
                                                              CONCAT16(local_4c8[0x16],
                                                                       CONCAT15(local_4c8[0x15],
                                                                                CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                )))));
                                    if (pcVar8 != (code *)0x0) {
                                      (*pcVar8)(&local_58,local_4c8,2);
                                      local_58._16_8_ =
                                           CONCAT17(local_4c8[0x17],
                                                    CONCAT16(local_4c8[0x16],
                                                             CONCAT15(local_4c8[0x15],
                                                                      CONCAT14(local_4c8[0x14],
                                                                               CONCAT13(local_4c8[
                                                  0x13],CONCAT12(local_4c8[0x12],
                                                                 CONCAT11(local_4c8[0x11],
                                                                          local_4c8[0x10])))))));
                                      local_58._24_8_ =
                                           CONCAT26(local_4c8._30_2_,
                                                    CONCAT15(local_4c8[0x1d],
                                                             CONCAT14(local_4c8[0x1c],
                                                                      CONCAT13(local_4c8[0x1b],
                                                                               CONCAT21(local_4c8.
                                                                                        _25_2_,
                                                  local_4c8[0x18])))));
                                    }
                                    target = local_6e0;
                                    bVar11 = ParseUniformEnumProperty<tinyusdz::GeomMesh::SubdivisionScheme,tinyusdz::GeomMesh::SubdivisionScheme>
                                                       ((string *)local_658,bVar11,
                                                        (
                                                  EnumHandlerFun<tinyusdz::GeomMesh::SubdivisionScheme>
                                                  *)&local_58,&local_6b8->_attrib,local_4d0,
                                                  local_6b0,(string *)local_6e0);
                                    if ((code *)local_58._16_8_ != (code *)0x0) {
                                      (*(code *)local_58._16_8_)(&local_58,&local_58,3);
                                    }
                                    if (local_658._0_8_ != (long)local_658 + 0x10) {
                                      operator_delete((void *)local_658._0_8_,
                                                      (ulong)(local_658._16_8_ + 1));
                                    }
                                    iVar13 = 1;
                                    if (!bVar11) goto LAB_00219737;
                                    AttrMetas::operator=
                                              (&local_4d0->_metas,(AttrMetas *)(p_Var18 + 7));
                                    pcVar21 = "subdivisionScheme";
                                    pcVar20 = "";
                                    goto LAB_00219702;
                                  }
                                }
                                else {
                                  iVar13 = ::std::__cxx11::string::compare((char *)__v);
                                  if (iVar13 == 0) {
                                    local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_4c8,"interpolateBoundary","");
                                    cVar17 = ::std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)local_4c8);
                                    if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                      operator_delete((void *)local_4c8._0_8_,
                                                      CONCAT17(local_4c8[0x17],
                                                               CONCAT16(local_4c8[0x16],
                                                                        CONCAT15(local_4c8[0x15],
                                                                                 CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                    }
                                    iVar13 = 3;
                                    if ((_Rb_tree_header *)cVar17._M_node !=
                                        &local_690._M_impl.super__Rb_tree_header) goto LAB_00219751;
                                    if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) ==
                                        0x200000000) {
                                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                      local_4c8[8] = false;
                                      local_4c8._9_3_ = 0;
                                      local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                      local_4c8[0x10] = '\0';
                                    }
                                    else {
                                      Attribute::type_name_abi_cxx11_
                                                ((string *)local_4c8,&local_6b8->_attrib);
                                    }
                                    uVar10 = local_4c8._0_8_;
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    local_658[8] = true;
                                    local_658._9_3_ = 0;
                                    local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_658._16_6_ = 0x6e656b6f74;
                                    if ((((optional<unsigned_int>)local_4c8._8_8_ ==
                                          (optional<unsigned_int>)0x5) &&
                                        (iVar13 = bcmp((void *)local_4c8._0_8_,local_658 + 0x10,5),
                                        iVar13 == 0)) &&
                                       (uVar7 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4),
                                       uVar7 < 2)) {
                                      if (uVar10 != (long)local_4c8 + 0x10) {
                                        operator_delete((void *)uVar10,
                                                        CONCAT17(local_4c8[0x17],
                                                                 CONCAT16(local_4c8[0x16],
                                                                          CONCAT15(local_4c8[0x15],
                                                                                   CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                      }
                                      if (uVar7 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"():",3);
                                        poVar15 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4c8,0xe7f);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," ",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"No value assigned to `",
                                                   0x16);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"interpolateBoundary",0x13);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                   "` token attribute. Set default token value.",
                                                   0x2b);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"\n",1);
                                        if (local_6b0 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_658,&local_700,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_6b0,(string *)local_658);
                                          if (local_658._0_8_ != (long)local_658 + 0x10) {
                                            operator_delete((void *)local_658._0_8_,
                                                            (ulong)(local_658._16_8_ + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                            operator_delete(local_700._M_dataplus._M_p,
                                                            (ulong)(local_700.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                        AttrMetas::operator=
                                                  (&local_4d8->_metas,(AttrMetas *)(p_Var18 + 7));
                                        pcVar21 = "interpolateBoundary";
                                        pcVar20 = "";
                                        goto LAB_00219555;
                                      }
                                    }
                                    else if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                      operator_delete((void *)local_4c8._0_8_,
                                                      CONCAT17(local_4c8[0x17],
                                                               CONCAT16(local_4c8[0x16],
                                                                        CONCAT15(local_4c8[0x15],
                                                                                 CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                    }
                                    local_4c8[0] = false;
                                    local_4c8._1_3_ = 0;
                                    local_4c8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_4c8[8] = false;
                                    local_4c8._9_3_ = 0;
                                    local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_4c8[0x18] = '2';
                                    local_4c8._25_2_ = 0x24f0;
                                    local_4c8[0x1b] = '\0';
                                    local_4c8[0x1c] = '\0';
                                    local_4c8[0x1d] = '\0';
                                    local_4c8._30_2_ = 0;
                                    local_4c8[0x10] = 't';
                                    local_4c8[0x11] = -6;
                                    local_4c8[0x12] = '$';
                                    local_4c8[0x13] = '\0';
                                    local_4c8[0x14] = '\0';
                                    local_4c8[0x15] = '\0';
                                    local_4c8[0x16] = '\0';
                                    local_4c8[0x17] = '\0';
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_658,"interpolateBoundary","");
                                    bVar11 = options->strict_allowedToken_check;
                                    local_78.super__Function_base._M_manager = (code *)0x0;
                                    local_78._M_invoker = (_Invoker_type)0x0;
                                    local_78.super__Function_base._M_functor._M_unused._M_object =
                                         (void *)0x0;
                                    local_78.super__Function_base._M_functor._8_8_ = 0;
                                    pcVar8 = (code *)CONCAT17(local_4c8[0x17],
                                                              CONCAT16(local_4c8[0x16],
                                                                       CONCAT15(local_4c8[0x15],
                                                                                CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                )))));
                                    if (pcVar8 != (code *)0x0) {
                                      (*pcVar8)(&local_78,local_4c8,2);
                                      local_78.super__Function_base._M_manager =
                                           (_Manager_type)
                                           CONCAT17(local_4c8[0x17],
                                                    CONCAT16(local_4c8[0x16],
                                                             CONCAT15(local_4c8[0x15],
                                                                      CONCAT14(local_4c8[0x14],
                                                                               CONCAT13(local_4c8[
                                                  0x13],CONCAT12(local_4c8[0x12],
                                                                 CONCAT11(local_4c8[0x11],
                                                                          local_4c8[0x10])))))));
                                      local_78._M_invoker =
                                           (_Invoker_type)
                                           CONCAT26(local_4c8._30_2_,
                                                    CONCAT15(local_4c8[0x1d],
                                                             CONCAT14(local_4c8[0x1c],
                                                                      CONCAT13(local_4c8[0x1b],
                                                                               CONCAT21(local_4c8.
                                                                                        _25_2_,
                                                  local_4c8[0x18])))));
                                    }
                                    target = local_6e0;
                                    bVar11 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::InterpolateBoundary,tinyusdz::GeomMesh::InterpolateBoundary>
                                                       ((string *)local_658,bVar11,&local_78,
                                                        &local_6b8->_attrib,local_4d8,local_6b0,
                                                        (string *)local_6e0);
                                    if (local_78.super__Function_base._M_manager != (code *)0x0) {
                                      (*local_78.super__Function_base._M_manager)
                                                (&local_78,&local_78,3);
                                    }
                                    if (local_658._0_8_ != (long)local_658 + 0x10) {
                                      operator_delete((void *)local_658._0_8_,
                                                      (ulong)(local_658._16_8_ + 1));
                                    }
                                    iVar13 = 1;
                                    if (!bVar11) goto LAB_00219737;
                                    AttrMetas::operator=
                                              (&local_4d8->_metas,(AttrMetas *)(p_Var18 + 7));
                                    pcVar21 = "interpolateBoundary";
                                    pcVar20 = "";
LAB_00219702:
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_658,pcVar21,pcVar20);
                                    ::std::
                                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                    ::_M_insert_unique<std::__cxx11::string>
                                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                *)&local_690,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_658);
                                    if (local_658._0_8_ != (long)local_658 + 0x10) {
                                      operator_delete((void *)local_658._0_8_,
                                                      (ulong)(local_658._16_8_ + 1));
                                    }
                                    iVar13 = 3;
                                  }
                                  else {
                                    iVar13 = ::std::__cxx11::string::compare((char *)__v);
                                    if (iVar13 != 0) {
                                      local_1f8._0_8_ = local_1e8;
                                      ::std::__cxx11::string::_M_construct<char*>
                                                (local_1f8,*(long *)(p_Var18 + 1),
                                                 (long)&(p_Var18[1]._M_parent)->_M_color +
                                                 *(long *)(p_Var18 + 1));
                                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_4c8,"skel:blendShapes","");
                                      pPVar22 = (Property *)local_4c8;
                                      (anonymous_namespace)::
                                      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                                                ((ParseResult *)local_658,
                                                 (_anonymous_namespace_ *)&local_690,
                                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_1f8,(string *)local_6b8,
                                                 (Property *)local_4c8,(string *)local_288._8_8_,
                                                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                                  *)target);
                                      if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                        operator_delete((void *)local_4c8._0_8_,
                                                        CONCAT17(local_4c8[0x17],
                                                                 CONCAT16(local_4c8[0x16],
                                                                          CONCAT15(local_4c8[0x15],
                                                                                   CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                      }
                                      if ((size_type *)local_1f8._0_8_ != local_1e8) {
                                        operator_delete((void *)local_1f8._0_8_,local_1e8[0] + 1);
                                      }
                                      iVar13 = 0;
                                      if ((local_658._0_8_ & 0xfffffffd) == 0) {
                                        iVar13 = 3;
LAB_0021887e:
                                        bVar11 = false;
                                      }
                                      else {
                                        bVar11 = true;
                                        if (local_658._0_4_ != Unmatched) {
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)local_4c8);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,"[error]",7);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,":",1);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_4c8,"():",3);
                                          poVar15 = (ostream *)
                                                    ::std::ostream::operator<<
                                                              ((Property *)local_4c8,0xe84);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar15," ",1);
                                          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
                                          ::std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_6d8,
                                                     "Parsing attribute `{}` failed. Error: {}","");
                                          fmt::format<char_const*,std::__cxx11::string>
                                                    (&local_700,(fmt *)&local_6d8,
                                                     (string *)&kSkelBlendShapes,
                                                     (char **)(local_658 + 8),
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pPVar22);
                                          poVar15 = ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_4c8,
                                                             local_700._M_dataplus._M_p,
                                                             local_700._M_string_length);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar15,"\n",1);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                            operator_delete(local_700._M_dataplus._M_p,
                                                            (ulong)(local_700.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
                                            operator_delete(local_6d8._M_dataplus._M_p,
                                                            (ulong)(local_6d8.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                          if (local_6e0 !=
                                              (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                                               *)0x0) {
                                            ::std::__cxx11::stringbuf::str();
                                            pTVar9 = local_6e0;
                                            ::std::operator+(&local_700,&local_6d8,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                            ::std::__cxx11::string::operator=
                                                      ((string *)pTVar9,(string *)&local_700);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_700._M_dataplus._M_p != &local_700.field_2)
                                            {
                                              operator_delete(local_700._M_dataplus._M_p,
                                                              (ulong)(local_700.field_2.
                                                                      _M_allocated_capacity + 1));
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_6d8._M_dataplus._M_p != &local_6d8.field_2)
                                            {
                                              operator_delete(local_6d8._M_dataplus._M_p,
                                                              (ulong)(local_6d8.field_2.
                                                                      _M_allocated_capacity + 1));
                                            }
                                          }
                                          ::std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)local_4c8);
                                          ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18))
                                          ;
                                          iVar13 = 1;
                                          goto LAB_0021887e;
                                        }
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_658._8_8_ != aaStack_640) {
                                        operator_delete((void *)local_658._8_8_,
                                                        (ulong)(aaStack_640[0]._M_allocated_capacity
                                                               + 1));
                                      }
                                      if (!bVar11) goto LAB_00219751;
                                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                      local_4c8[0x10] = 's';
                                      local_4c8[0x11] = 'u';
                                      local_4c8[0x12] = 'b';
                                      local_4c8[0x13] = 's';
                                      local_4c8[0x14] = 'e';
                                      local_4c8[0x15] = 't';
                                      local_4c8[0x16] = 'F';
                                      local_4c8[0x17] = 'a';
                                      local_4c8[0x18] = 'm';
                                      local_4c8._25_2_ = 0x6c69;
                                      local_4c8[0x1b] = 'y';
                                      local_4c8[8] = true;
                                      local_4c8._9_3_ = 0;
                                      local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                      local_4c8[0x1c] = '\0';
                                      if (((_Base_ptr)0xb < p_Var18[1]._M_parent) &&
                                         ((int)(*(long **)__v)[1] == 0x796c696d &&
                                          **(long **)__v == 0x6146746573627573)) {
                                        local_4c8[0x10] = ':';
                                        local_4c8[0x11] = '\0';
                                        local_4c8[8] = true;
                                        local_4c8._9_3_ = 0;
                                        local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                        local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                        split(&local_6a8,(string *)__v,(string *)local_4c8,0x147ae14
                                             );
                                        if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                          operator_delete((void *)local_4c8._0_8_,
                                                          CONCAT17(local_4c8[0x17],
                                                                   CONCAT16(local_4c8[0x16],
                                                                            CONCAT15(local_4c8[0x15]
                                                                                     ,CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                        }
                                        iVar13 = 0;
                                        if ((((long)local_6a8.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_6a8.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0x60)
                                            && (iVar14 = ::std::__cxx11::string::compare
                                                                   ((char *)local_6a8.
                                                                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                                               iVar13 = 0, iVar14 == 0)) &&
                                           (iVar14 = ::std::__cxx11::string::compare
                                                               ((char *)(local_6a8.
                                                                                                                                                  
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2)),
                                           iVar13 = 0, iVar14 == 0)) {
                                          local_4c8._0_8_ =
                                               ((ulong)local_4c8._0_8_ >> 8 & 0xffffff) << 8;
                                          local_4c8._8_8_ =
                                               ((ulong)local_4c8._8_8_ >> 8 & 0xffffff) << 8;
                                          local_4c8[0x10] = '\0';
                                          local_4c8[0x11] = '\0';
                                          local_4c8[0x18] = '\0';
                                          local_438 = (storage_t<double>)0x0;
                                          local_430 = false;
                                          local_328._16_8_ = 0;
                                          local_328._24_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_328._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_328._8_8_ = 0;
                                          local_300._M_color = 0;
                                          local_300._M_parent = (_Base_ptr)0x0;
                                          sStack_480._8_1_ = 0;
                                          aStack_490._8_8_ = 0;
                                          sStack_480.dynamic = (void *)0x0;
                                          local_4c8._48_8_ = 0;
                                          aStack_490._M_allocated_capacity = 0;
                                          local_4c8._32_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_4c8._40_8_ = (pointer)0x0;
                                          local_440 = false;
                                          local_470._32_8_ = (pointer)0x0;
                                          local_470._40_8_ = 0;
                                          local_470._16_8_ = (pointer)0x0;
                                          local_470._24_8_ = (pointer)0x0;
                                          local_470._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_470._8_8_ = 0;
                                          local_408[0] = 0;
                                          local_428._16_8_ = 0;
                                          local_428._24_8_ = 0;
                                          local_428.data.__align =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_428._8_1_ = false;
                                          local_428._9_3_ = 0;
                                          local_428._12_4_ = (storage_t<unsigned_int>)0x0;
                                          local_408[0x28] = 0;
                                          local_408._24_8_ = 0;
                                          local_408._32_8_ = 0;
                                          local_408._8_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_408._16_8_ = 0;
                                          local_3d8[0x20] = 0;
                                          local_3d8._16_8_ = 0;
                                          local_3d8._24_8_ = 0;
                                          local_3d8._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_3d8._8_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_3b0[0x30] = 0;
                                          local_3b0._32_8_ = 0;
                                          local_3b0._40_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_3b0._16_8_ = 0;
                                          local_3b0._24_8_ = (storage_t<double>)0x0;
                                          local_3b0._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_3b0._8_8_ = 0;
                                          local_378[0x20] = 0;
                                          local_378._16_8_ = 0;
                                          local_378._24_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_378._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_378._8_8_ = 0;
                                          local_350[0x20] = 0;
                                          local_350._16_8_ = 0;
                                          local_350._24_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_350._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_350._8_8_ = 0;
                                          local_300._M_left = &local_300;
                                          sStack_2b0._12_4_ = 0;
                                          sStack_2b0._16_1_ = 0;
                                          sStack_2b0._0_1_ = 0;
                                          sStack_2b0._1_8_ = 0;
                                          auStack_2d8._24_8_ = 0;
                                          bStack_2b8 = false;
                                          local_2b7 = 0;
                                          auStack_2d8._8_8_ = 0;
                                          auStack_2d8._16_8_ = 0;
                                          local_2e0 = 0;
                                          auStack_2d8._0_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          sStack_2b0._20_4_ = 2;
                                          sStack_2b0._24_1_ = 0;
                                          local_300._M_right = local_300._M_left;
                                          _Var12 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                                          if (_Var12) {
                                            cVar17 = ::std::
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)__v);
                                            iVar13 = 3;
                                            if ((_Rb_tree_header *)cVar17._M_node ==
                                                &local_690._M_impl.super__Rb_tree_header) {
                                              if (((ulong)p_Var18[0x17]._M_parent &
                                                  0xfffffffe00000000) == 0x200000000) {
                                                local_658._0_8_ = (long)local_658 + 0x10;
                                                local_658[8] = false;
                                                local_658._9_3_ = 0;
                                                local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                                local_658._16_8_ =
                                                     local_658._16_8_ & 0xffffffffffffff00;
                                              }
                                              else {
                                                Attribute::type_name_abi_cxx11_
                                                          ((string *)local_658,&local_6b8->_attrib);
                                              }
                                              uVar10 = local_658._0_8_;
                                              local_700._M_dataplus._M_p =
                                                   (pointer)&local_700.field_2;
                                              local_700._M_string_length._0_1_ = true;
                                              local_700._M_string_length._1_3_ = 0;
                                              local_700._M_string_length._4_4_ =
                                                   (storage_t<unsigned_int>)0x0;
                                              local_700.field_2._M_allocated_capacity._0_6_ =
                                                   0x6e656b6f74;
                                              if ((((optional<unsigned_int>)local_658._8_8_ ==
                                                    (optional<unsigned_int>)0x5) &&
                                                  (iVar14 = bcmp((void *)local_658._0_8_,
                                                                 &local_700.field_2,5), iVar14 == 0)
                                                  ) && (uVar7 = *(uint *)((long)&p_Var18[0x17].
                                                                                 _M_parent + 4),
                                                       uVar7 < 2)) {
                                                if (uVar10 != (long)local_658 + 0x10) {
                                                  operator_delete((void *)uVar10,
                                                                  (ulong)(local_658._16_8_ + 1));
                                                }
                                                if (uVar7 == 0) {
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            ((ostringstream *)local_658);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,"[warn]",6);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,":",1);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,"ReconstructPrim",
                                                             0xf);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,"():",3);
                                                  poVar15 = (ostream *)
                                                            ::std::ostream::operator<<
                                                                      ((ostringstream *)local_658,
                                                                       0xe94);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (poVar15," ",1);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,
                                                             "No value assigned to `",0x16);
                                                  poVar15 = ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_658,
                                                             *(char **)(p_Var18 + 1),
                                                             (long)p_Var18[1]._M_parent);
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (poVar15,
                                                  "` token attribute. Set default token value.",0x2b
                                                  );
                                                  ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (poVar15,"\n",1);
                                                  if (local_6b0 != (string *)0x0) {
                                                    ::std::__cxx11::stringbuf::str();
                                                    ::std::operator+(&local_700,&local_6d8,
                                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                                  ::std::__cxx11::string::operator=
                                                            ((string *)local_6b0,
                                                             (string *)&local_700);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_700._M_dataplus._M_p != &local_700.field_2
                                                  ) {
                                                    operator_delete(local_700._M_dataplus._M_p,
                                                                    (ulong)(local_700.field_2.
                                                                            _M_allocated_capacity +
                                                                           1));
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_6d8._M_dataplus._M_p != &local_6d8.field_2
                                                  ) {
                                                    operator_delete(local_6d8._M_dataplus._M_p,
                                                                    (ulong)(local_6d8.field_2.
                                                                            _M_allocated_capacity +
                                                                           1));
                                                  }
                                                  }
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)local_658);
                                                  ::std::ios_base::~ios_base(local_5e8);
                                                  AttrMetas::operator=
                                                            ((AttrMetas *)local_4c8,
                                                             (AttrMetas *)(p_Var18 + 7));
                                                  ::std::
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  ::_M_insert_unique<std::__cxx11::string_const&>
                                                            ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_690,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                                                  goto LAB_00219a6c;
                                                }
                                              }
                                              else if (local_658._0_8_ != (long)local_658 + 0x10) {
                                                operator_delete((void *)local_658._0_8_,
                                                                (ulong)(local_658._16_8_ + 1));
                                              }
                                              local_658[0] = false;
                                              local_658._1_3_ = 0;
                                              local_658._4_4_ = (storage_t<unsigned_int>)0x0;
                                              local_658[8] = false;
                                              local_658._9_3_ = 0;
                                              local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                              aaStack_640[0]._M_allocated_capacity =
                                                   ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                  ::_M_invoke;
                                              local_658._16_8_ =
                                                   ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                  ::_M_manager;
                                              local_218._M_unused._M_object = (void *)0x0;
                                              local_218._8_8_ = (pointer)0x0;
                                              pcStack_200 = ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                  ::_M_invoke;
                                              local_208 = ::std::
                                                  _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::FamilyType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3666:28)>
                                                  ::_M_manager;
                                              target = local_6e0;
                                              bVar11 = 
                                                  ParseUniformEnumProperty<tinyusdz::GeomSubset::FamilyType,tinyusdz::GeomSubset::FamilyType>
                                                            ((string *)__v,
                                                             options->strict_allowedToken_check,
                                                             (
                                                  EnumHandlerFun<tinyusdz::GeomSubset::FamilyType> *
                                                  )&local_218,&local_6b8->_attrib,
                                                  (
                                                  TypedAttributeWithFallback<tinyusdz::GeomSubset::FamilyType>
                                                  *)local_4c8,local_6b0,(string *)local_6e0);
                                              if (local_208 != (code *)0x0) {
                                                (*local_208)(&local_218,&local_218,__destroy_functor
                                                            );
                                              }
                                              iVar13 = 1;
                                              if (bVar11) {
                                                AttrMetas::operator=
                                                          ((AttrMetas *)local_4c8,
                                                           (AttrMetas *)(p_Var18 + 7));
                                                ::std::
                                                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                ::_M_insert_unique<std::__cxx11::string_const&>
                                                          ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_690,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                                                iVar13 = 3;
                                              }
                                              if ((code *)local_658._16_8_ != (code *)0x0) {
                                                (*(code *)local_658._16_8_)(local_658,local_658,3);
                                              }
                                            }
                                          }
                                          else {
                                            mVar6 = *(mapped_type *)
                                                     ((long)&sStack_2b0 +
                                                     (ulong)((byte)sStack_2b0._8_1_ ^ 1) * 8 + 0xc);
                                            local_658[8] = false;
                                            local_658._9_3_ = 0;
                                            local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                            local_658._16_8_ = local_658._16_8_ & 0xffffffffffffff00
                                            ;
                                            local_658._0_8_ = (long)local_658 + 0x10;
                                            ::std::__cxx11::string::_M_assign((string *)local_658);
                                            pmVar19 = ::std::
                                                  map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                                                  ::operator[](local_290,(key_type *)local_658);
                                            *pmVar19 = mVar6;
                                            if (local_658._0_8_ != (long)local_658 + 0x10) {
                                              operator_delete((void *)local_658._0_8_,
                                                              (ulong)(local_658._16_8_ + 1));
                                            }
                                            iVar13 = 0;
                                          }
LAB_00219a6c:
                                          ::std::
                                          vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                                          ~vector((
                                                  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                                  *)(auStack_2d8 + 0x18));
                                          AttrMetas::~AttrMetas((AttrMetas *)local_4c8);
                                        }
                                        ::std::
                                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~vector(&local_6a8);
                                        if (iVar13 != 0) goto LAB_00219751;
                                      }
                                      cVar17 = ::std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)__v);
                                      p_Var5 = &local_690._M_impl.super__Rb_tree_header;
                                      if ((_Rb_tree_header *)cVar17._M_node == p_Var5) {
                                        this = ::std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                               ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)local_288.data._0_8_,(key_type *)__v);
                                        Property::operator=(this,local_6b8);
                                        ::std::
                                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        ::_M_insert_unique<std::__cxx11::string_const&>
                                                  ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_690,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                                      }
                                      cVar17 = ::std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)__v);
                                      iVar13 = 0;
                                      if ((_Rb_tree_header *)cVar17._M_node == p_Var5) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"():",3);
                                        poVar15 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4c8,0xea0);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," ",1);
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_658,"Unsupported/unimplemented property: "
                                                  ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__v);
                                        poVar15 = ::std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)local_4c8,
                                                             (char *)local_658._0_8_,local_658._8_8_
                                                            );
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15,"\n",1);
                                        if (local_658._0_8_ != (long)local_658 + 0x10) {
                                          operator_delete((void *)local_658._0_8_,
                                                          (ulong)(local_658._16_8_ + 1));
                                        }
                                        if (local_6b0 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_658,&local_700,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_6b0,(string *)local_658);
                                          if (local_658._0_8_ != (long)local_658 + 0x10) {
                                            operator_delete((void *)local_658._0_8_,
                                                            (ulong)(local_658._16_8_ + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                            operator_delete(local_700._M_dataplus._M_p,
                                                            (ulong)(local_700.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                      }
                                      goto LAB_00219751;
                                    }
                                    local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_4c8,"facevaryingLinearInterpolation",
                                               "");
                                    cVar17 = ::std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_690,(key_type *)local_4c8);
                                    if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                      operator_delete((void *)local_4c8._0_8_,
                                                      CONCAT17(local_4c8[0x17],
                                                               CONCAT16(local_4c8[0x16],
                                                                        CONCAT15(local_4c8[0x15],
                                                                                 CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                    }
                                    iVar13 = 3;
                                    if ((_Rb_tree_header *)cVar17._M_node !=
                                        &local_690._M_impl.super__Rb_tree_header) goto LAB_00219751;
                                    if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) ==
                                        0x200000000) {
                                      local_4c8._0_8_ = (long)local_4c8 + 0x10;
                                      local_4c8[8] = false;
                                      local_4c8._9_3_ = 0;
                                      local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                      local_4c8[0x10] = '\0';
                                    }
                                    else {
                                      Attribute::type_name_abi_cxx11_
                                                ((string *)local_4c8,&local_6b8->_attrib);
                                    }
                                    uVar10 = local_4c8._0_8_;
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    local_658[8] = true;
                                    local_658._9_3_ = 0;
                                    local_658._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_658._16_6_ = 0x6e656b6f74;
                                    if ((((optional<unsigned_int>)local_4c8._8_8_ ==
                                          (optional<unsigned_int>)0x5) &&
                                        (iVar13 = bcmp((void *)local_4c8._0_8_,local_658 + 0x10,5),
                                        iVar13 == 0)) &&
                                       (uVar7 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4),
                                       uVar7 < 2)) {
                                      if (uVar10 != (long)local_4c8 + 0x10) {
                                        operator_delete((void *)uVar10,
                                                        CONCAT17(local_4c8[0x17],
                                                                 CONCAT16(local_4c8[0x16],
                                                                          CONCAT15(local_4c8[0x15],
                                                                                   CONCAT14(
                                                  local_4c8[0x14],
                                                  CONCAT13(local_4c8[0x13],
                                                           CONCAT12(local_4c8[0x12],
                                                                    CONCAT11(local_4c8[0x11],
                                                                             local_4c8[0x10])))))))
                                                  + 1);
                                      }
                                      if (uVar7 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"ReconstructPrim",0xf);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"():",3);
                                        poVar15 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((ostringstream *)local_4c8,0xe82);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar15," ",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"No value assigned to `",
                                                   0x16);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                   "facevaryingLinearInterpolation",0x1e);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,
                                                   "` token attribute. Set default token value.",
                                                   0x2b);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_4c8,"\n",1);
                                        if (local_6b0 != (string *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_658,&local_700,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6e0);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_6b0,(string *)local_658);
                                          if (local_658._0_8_ != (long)local_658 + 0x10) {
                                            operator_delete((void *)local_658._0_8_,
                                                            (ulong)(local_658._16_8_ + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_700._M_dataplus._M_p != &local_700.field_2) {
                                            operator_delete(local_700._M_dataplus._M_p,
                                                            (ulong)(local_700.field_2.
                                                                    _M_allocated_capacity + 1));
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)local_4c8);
                                        ::std::ios_base::~ios_base((ios_base *)(local_470 + 0x18));
                                        AttrMetas::operator=
                                                  (&local_4e0->_metas,(AttrMetas *)(p_Var18 + 7));
                                        pcVar21 = "facevaryingLinearInterpolation";
                                        pcVar20 = "";
                                        goto LAB_00219555;
                                      }
                                    }
                                    else if (local_4c8._0_8_ != (long)local_4c8 + 0x10) {
                                      operator_delete((void *)local_4c8._0_8_,
                                                      CONCAT17(local_4c8[0x17],
                                                               CONCAT16(local_4c8[0x16],
                                                                        CONCAT15(local_4c8[0x15],
                                                                                 CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                ))))) + 1);
                                    }
                                    local_4c8[0] = false;
                                    local_4c8._1_3_ = 0;
                                    local_4c8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_4c8[8] = false;
                                    local_4c8._9_3_ = 0;
                                    local_4c8._12_4_ = (storage_t<unsigned_int>)0x0;
                                    local_4c8[0x18] = -0x74;
                                    local_4c8._25_2_ = 0x24fa;
                                    local_4c8[0x1b] = '\0';
                                    local_4c8[0x1c] = '\0';
                                    local_4c8[0x1d] = '\0';
                                    local_4c8._30_2_ = 0;
                                    local_4c8[0x10] = '\f';
                                    local_4c8[0x11] = '\x05';
                                    local_4c8[0x12] = '%';
                                    local_4c8[0x13] = '\0';
                                    local_4c8[0x14] = '\0';
                                    local_4c8[0x15] = '\0';
                                    local_4c8[0x16] = '\0';
                                    local_4c8[0x17] = '\0';
                                    local_658._0_8_ = (long)local_658 + 0x10;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_658,"facevaryingLinearInterpolation",
                                               "");
                                    bVar11 = options->strict_allowedToken_check;
                                    local_88._M_p = (pointer)0x0;
                                    auStack_80 = (undefined1  [8])0x0;
                                    local_98._M_allocated_capacity = 0;
                                    local_98._8_8_ = (storage_t<double>)0x0;
                                    pcVar8 = (code *)CONCAT17(local_4c8[0x17],
                                                              CONCAT16(local_4c8[0x16],
                                                                       CONCAT15(local_4c8[0x15],
                                                                                CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                )))));
                                    if (pcVar8 != (code *)0x0) {
                                      (*pcVar8)(&local_98,local_4c8,2);
                                      local_88._M_p =
                                           (pointer)CONCAT17(local_4c8[0x17],
                                                             CONCAT16(local_4c8[0x16],
                                                                      CONCAT15(local_4c8[0x15],
                                                                               CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                )))));
                                      auStack_80._1_2_ = local_4c8._25_2_;
                                      auStack_80[0] = local_4c8[0x18];
                                      auStack_80[3] = local_4c8[0x1b];
                                      auStack_80[4] = local_4c8[0x1c];
                                      auStack_80[5] = local_4c8[0x1d];
                                      auStack_80._6_2_ = local_4c8._30_2_;
                                    }
                                    target = local_6e0;
                                    bVar11 = ParseTimeSampledEnumProperty<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation,tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                                       ((string *)local_658,bVar11,
                                                        (
                                                  EnumHandlerFun<tinyusdz::GeomMesh::FaceVaryingLinearInterpolation>
                                                  *)&local_98,&local_6b8->_attrib,local_4e0,
                                                  local_6b0,(string *)local_6e0);
                                    if ((code *)local_88._M_p != (code *)0x0) {
                                      (*(code *)local_88._M_p)
                                                ((_Any_data *)&local_98,(_Any_data *)&local_98,
                                                 __destroy_functor);
                                    }
                                    if (local_658._0_8_ != (long)local_658 + 0x10) {
                                      operator_delete((void *)local_658._0_8_,
                                                      (ulong)(local_658._16_8_ + 1));
                                    }
                                    iVar13 = 1;
                                    if (bVar11) {
                                      AttrMetas::operator=
                                                (&local_4e0->_metas,(AttrMetas *)(p_Var18 + 7));
                                      pcVar21 = "facevaryingLinearInterpolation";
                                      pcVar20 = "";
                                      goto LAB_00219702;
                                    }
                                  }
LAB_00219737:
                                  pcVar8 = (code *)CONCAT17(local_4c8[0x17],
                                                            CONCAT16(local_4c8[0x16],
                                                                     CONCAT15(local_4c8[0x15],
                                                                              CONCAT14(local_4c8[
                                                  0x14],CONCAT13(local_4c8[0x13],
                                                                 CONCAT12(local_4c8[0x12],
                                                                          CONCAT11(local_4c8[0x11],
                                                                                   local_4c8[0x10]))
                                                                )))));
                                  if (pcVar8 != (code *)0x0) {
                                    (*pcVar8)(local_4c8,local_4c8,3);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00219751:
        if ((iVar13 != 3) && (iVar13 != 0)) break;
        p_Var18 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
        bVar23 = p_Var18 == local_220;
      } while (!bVar23);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_690,(_Link_type)local_690._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar23;
}

Assistant:

bool ReconstructPrim<GeomMesh>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomMesh *mesh,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  DCOUT("GeomMesh");

  auto SubdivisionSchemeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::SubdivisionScheme, std::string> {
    using EnumTy = std::pair<GeomMesh::SubdivisionScheme, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::SubdivisionScheme::SubdivisionSchemeNone, "none"),
        std::make_pair(GeomMesh::SubdivisionScheme::CatmullClark,
                       "catmullClark"),
        std::make_pair(GeomMesh::SubdivisionScheme::Loop, "loop"),
        std::make_pair(GeomMesh::SubdivisionScheme::Bilinear, "bilinear"),
    };
    return EnumHandler<GeomMesh::SubdivisionScheme>("subdivisionScheme", tok,
                                                    enums);
  };

  auto InterpolateBoundaryHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::InterpolateBoundary, std::string> {
    using EnumTy = std::pair<GeomMesh::InterpolateBoundary, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::InterpolateBoundary::InterpolateBoundaryNone, "none"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeAndCorner,
                       "edgeAndCorner"),
        std::make_pair(GeomMesh::InterpolateBoundary::EdgeOnly, "edgeOnly"),
    };
    return EnumHandler<GeomMesh::InterpolateBoundary>("interpolateBoundary",
                                                      tok, enums);
  };

  auto FaceVaryingLinearInterpolationHandler = [](const std::string &tok)
      -> nonstd::expected<GeomMesh::FaceVaryingLinearInterpolation,
                          std::string> {
    using EnumTy =
        std::pair<GeomMesh::FaceVaryingLinearInterpolation, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus1,
                       "cornersPlus1"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersPlus2,
                       "cornersPlus2"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::CornersOnly,
                       "cornersOnly"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::Boundaries,
                       "boundaries"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::FaceVaryingLinearInterpolationNone, "none"),
        std::make_pair(GeomMesh::FaceVaryingLinearInterpolation::All, "all"),
    };
    return EnumHandler<GeomMesh::FaceVaryingLinearInterpolation>(
        "facevaryingLinearInterpolation", tok, enums);
  };

  auto FamilyTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::FamilyType, std::string> {
    using EnumTy = std::pair<GeomSubset::FamilyType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::FamilyType::Partition, "partition"),
        std::make_pair(GeomSubset::FamilyType::NonOverlapping, "nonOverlapping"),
        std::make_pair(GeomSubset::FamilyType::Unrestricted, "unrestricted"),
    };
    return EnumHandler<GeomSubset::FamilyType>("familyType", tok,
                                                    enums);
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, mesh, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("GeomMesh prop: " << prop.first);
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kSkelSkeleton, mesh->skeleton)
    PARSE_TARGET_PATHS_RELATION(table, prop, kSkelBlendShapeTargets, mesh->blendShapeTargets)
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomMesh, mesh->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomMesh, mesh->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexCounts", GeomMesh,
                         mesh->faceVertexCounts)
    PARSE_TYPED_ATTRIBUTE(table, prop, "faceVertexIndices", GeomMesh,
                         mesh->faceVertexIndices)
    // Subd
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerIndices", GeomMesh,
                         mesh->cornerIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "cornerSharpnesses", GeomMesh,
                         mesh->cornerSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseIndices", GeomMesh,
                         mesh->creaseIndices)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseLengths", GeomMesh,
                         mesh->creaseLengths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "creaseSharpnesses", GeomMesh,
                         mesh->creaseSharpnesses)
    PARSE_TYPED_ATTRIBUTE(table, prop, "holeIndices", GeomMesh,
                         mesh->holeIndices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "subdivisionScheme", GeomMesh::SubdivisionScheme,
                       SubdivisionSchemeHandler, GeomMesh,
                       mesh->subdivisionScheme, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "interpolateBoundary",
                       GeomMesh::InterpolateBoundary, InterpolateBoundaryHandler, GeomMesh,
                       mesh->interpolateBoundary, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "facevaryingLinearInterpolation",
                       GeomMesh::FaceVaryingLinearInterpolation, FaceVaryingLinearInterpolationHandler, GeomMesh,
                       mesh->faceVaryingLinearInterpolation, options.strict_allowedToken_check)
    // blendShape names
    PARSE_TYPED_ATTRIBUTE(table, prop, kSkelBlendShapes, GeomMesh, mesh->blendShapes)

    // subsetFamily for GeomSubset
    if (startsWith(prop.first, "subsetFamily")) {
      // uniform subsetFamily::<FAMILYNAME>:familyType = ...
      std::vector<std::string> names = split(prop.first, ":");

      if ((names.size() == 3) &&
          (names[0] == "subsetFamily") &&
          (names[2] == "familyType")) {

        DCOUT("subsetFamily" << prop.first);
        TypedAttributeWithFallback<GeomSubset::FamilyType> familyType{GeomSubset::FamilyType::Unrestricted};

        PARSE_UNIFORM_ENUM_PROPERTY(table, prop, prop.first,
                           GeomSubset::FamilyType, FamilyTypeHandler, GeomMesh,
                           familyType, options.strict_allowedToken_check)

        // NOTE: Ignore metadataum of familyType.
        
        // TODO: Validate familyName
        mesh->subsetFamilyTypeMap[value::token(names[1])] = familyType.get_value();

      }
    }

    // generic
    ADD_PROPERTY(table, prop, GeomMesh, mesh->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }


  return true;
}